

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [24];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 (*pauVar61) [32];
  long in_RSI;
  double dVar62;
  float fVar63;
  float fVar64;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 two_2;
  __m256 one_6;
  __m256 two;
  __m256 one;
  __m128 two_3;
  __m128 one_9;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 one_7;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_8;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m128 one_4;
  __m128 one_10;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined1 (*in_stack_ffffffffffffd6c8) [16];
  undefined4 in_stack_ffffffffffffd6d0;
  undefined4 in_stack_ffffffffffffd6d4;
  undefined8 local_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  int local_28cc;
  Mat local_28c8;
  undefined1 (*local_2880) [32];
  int local_2874;
  undefined1 local_2870 [16];
  int local_285c;
  Mat local_2858;
  undefined1 (*local_2810) [16];
  int local_2804;
  undefined1 local_2800 [32];
  int local_27c8;
  Mat local_27b8;
  undefined1 (*local_2770) [32];
  int local_2768;
  int local_2764;
  int local_2760;
  int local_275c;
  int local_2758;
  int local_2754;
  undefined1 (*local_2730) [32];
  undefined1 (*local_2728) [32];
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 (*local_2628) [32];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 (*local_25e8) [32];
  undefined1 (*local_25e0) [32];
  undefined1 (*local_25d8) [16];
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 (*local_2558) [32];
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 (*local_2538) [16];
  undefined4 local_2530;
  undefined4 local_252c;
  undefined4 local_2528;
  undefined4 local_2524;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined1 local_24c0 [32];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [8];
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  float local_2380;
  float fStack_237c;
  float fStack_2378;
  float fStack_2374;
  float fStack_2370;
  float fStack_236c;
  float fStack_2368;
  undefined4 uStack_2364;
  undefined4 local_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  ulong uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  undefined4 uStack_22c4;
  undefined4 local_22a4;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  ulong uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined1 local_2260 [16];
  undefined1 auStack_2250 [16];
  undefined4 local_2240;
  undefined4 local_223c;
  undefined4 local_2238;
  undefined4 local_2234;
  undefined4 local_2230;
  undefined4 local_222c;
  undefined4 local_2228;
  undefined4 local_2224;
  undefined1 local_2220 [16];
  undefined1 auStack_2210 [16];
  undefined4 local_2200;
  undefined4 local_21fc;
  undefined4 local_21f8;
  undefined4 local_21f4;
  undefined4 local_21f0;
  undefined4 local_21ec;
  undefined4 local_21e8;
  undefined4 local_21e4;
  undefined1 local_21e0 [16];
  undefined1 auStack_21d0 [16];
  undefined4 local_21c0;
  undefined4 local_21bc;
  undefined4 local_21b8;
  undefined4 local_21b4;
  undefined4 local_21b0;
  undefined4 local_21ac;
  undefined4 local_21a8;
  undefined4 local_21a4;
  undefined1 local_21a0 [16];
  undefined1 auStack_2190 [16];
  undefined4 local_2180;
  undefined4 local_217c;
  undefined4 local_2178;
  undefined4 local_2174;
  undefined4 local_2170;
  undefined4 local_216c;
  undefined4 local_2168;
  undefined4 local_2164;
  undefined1 local_2160 [16];
  undefined1 auStack_2150 [16];
  undefined4 local_2140;
  undefined4 local_213c;
  undefined4 local_2138;
  undefined4 local_2134;
  undefined4 local_2130;
  undefined4 local_212c;
  undefined4 local_2128;
  undefined4 local_2124;
  undefined1 local_2120 [16];
  undefined1 auStack_2110 [16];
  undefined4 local_2100;
  undefined4 local_20fc;
  undefined4 local_20f8;
  undefined4 local_20f4;
  undefined4 local_20f0;
  undefined4 local_20ec;
  undefined4 local_20e8;
  undefined4 local_20e4;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined1 local_20c0 [32];
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined1 local_2040 [8];
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float fStack_2024;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float fStack_1fa8;
  float fStack_1fa4;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined1 local_1f80 [32];
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [8];
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [8];
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined1 local_1de0 [32];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  undefined1 local_18e0 [32];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [8];
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 local_1860 [8];
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 local_1840 [32];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [16];
  undefined1 local_fb0 [16];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [16];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_df0 [16];
  undefined1 local_de0 [16];
  undefined4 local_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d30 [16];
  undefined1 local_d20 [16];
  undefined4 local_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined4 local_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined4 local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined4 local_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b88;
  undefined4 uStack_b84;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined4 local_b14;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [16];
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  undefined4 local_a30;
  undefined4 uStack_a2c;
  undefined4 uStack_a28;
  undefined4 uStack_a24;
  undefined4 local_a14;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  ulong uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined4 local_9b4;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  ulong uStack_998;
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [8];
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined4 local_854;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined1 local_7d0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2754 = *(int *)(in_RSI + 0x2c);
  local_2758 = *(int *)(in_RSI + 0x30);
  local_275c = *(int *)(in_RSI + 0x38);
  local_2760 = local_2754 * local_2758;
  local_2764 = *(int *)(in_RSI + 0x18);
  if (local_2764 == 8) {
    local_2764 = 8;
    for (local_2768 = 0; local_2768 < local_275c; local_2768 = local_2768 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd6d4,in_stack_ffffffffffffd6d0),
                         (int)((ulong)in_stack_ffffffffffffd6c8 >> 0x20));
      pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_27b8);
      ncnn::Mat::~Mat((Mat *)0x518494);
      local_2770 = pauVar61;
      for (local_27c8 = 0; local_27c8 < local_2760; local_27c8 = local_27c8 + 1) {
        local_2728 = local_2770;
        auVar58 = *(undefined1 (*) [24])*local_2770;
        uStack_2668 = *(undefined8 *)(*local_2770 + 0x18);
        local_2800._0_8_ = auVar58._0_8_;
        local_2680 = local_2800._0_8_;
        local_2800._8_8_ = auVar58._8_8_;
        uStack_2678 = local_2800._8_8_;
        local_2800._16_8_ = auVar58._16_8_;
        uStack_2670 = local_2800._16_8_;
        local_252c = 0x3f800000;
        in_stack_ffffffffffffd6d4 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2160 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2150 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_26a0 = local_2160._0_8_;
        uStack_2698 = local_2160._8_8_;
        uStack_2690 = auStack_2150._0_8_;
        uStack_2688 = auStack_2150._8_8_;
        local_2530 = 0x40000000;
        local_2100 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_2120 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_2110 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_26c0 = local_2120._0_8_;
        uStack_26b8 = local_2120._8_8_;
        uStack_26b0 = auStack_2110._0_8_;
        uStack_26a8 = auStack_2110._8_8_;
        uVar7 = local_2800._0_8_;
        uVar8 = local_2800._8_8_;
        uVar9 = local_2800._16_8_;
        local_2440._0_4_ = auVar58._0_4_;
        local_2440._4_4_ = auVar58._4_4_;
        uStack_2438._0_4_ = auVar58._8_4_;
        uStack_2438._4_4_ = auVar58._12_4_;
        uStack_2430._0_4_ = auVar58._16_4_;
        uStack_2430._4_4_ = auVar58._20_4_;
        uStack_2428._0_4_ = (float)uStack_2668;
        uStack_2428._4_4_ = (undefined4)((ulong)uStack_2668 >> 0x20);
        uStack_2364 = uStack_2428._4_4_;
        local_2460._0_4_ = local_2120._0_4_;
        local_2460._4_4_ = local_2120._4_4_;
        uStack_2458._0_4_ = local_2120._8_4_;
        uStack_2458._4_4_ = local_2120._12_4_;
        uStack_2450._0_4_ = auStack_2110._0_4_;
        uStack_2450._4_4_ = auStack_2110._4_4_;
        uStack_2448._0_4_ = auStack_2110._8_4_;
        local_2380 = (float)local_2440 * (float)local_2460;
        fStack_237c = local_2440._4_4_ * local_2460._4_4_;
        fStack_2378 = (float)uStack_2438 * (float)uStack_2458;
        fStack_2374 = uStack_2438._4_4_ * uStack_2458._4_4_;
        fStack_2370 = (float)uStack_2430 * (float)uStack_2450;
        fStack_236c = uStack_2430._4_4_ * uStack_2450._4_4_;
        fStack_2368 = (float)uStack_2428 * (float)uStack_2448;
        local_2344 = 0x3f800000;
        local_2200 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2220 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2210 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_23a0 = local_2220._0_8_;
        uStack_2398 = local_2220._8_8_;
        uStack_2390 = auStack_2210._0_8_;
        uStack_2388 = auStack_2210._8_8_;
        local_2080 = local_2220._0_8_;
        uStack_2078 = local_2220._8_8_;
        uStack_2070 = auStack_2210._0_8_;
        uStack_2068 = auStack_2210._8_8_;
        local_12a0 = ZEXT832(0) << 0x20;
        local_2320 = 0;
        local_1240._8_8_ = SUB328(ZEXT832(0),4);
        uStack_2318 = local_1240._8_8_;
        uStack_2310 = 0;
        uStack_2308 = 0;
        local_2340 = CONCAT44(fStack_237c,local_2380);
        uStack_2338 = CONCAT44(fStack_2374,fStack_2378);
        uStack_2330 = CONCAT44(fStack_236c,fStack_2370);
        uStack_2328 = CONCAT44(uStack_2428._4_4_,fStack_2368);
        auVar16._8_8_ = uStack_2338;
        auVar16._0_8_ = local_2340;
        auVar16._16_8_ = uStack_2330;
        auVar16._24_8_ = uStack_2328;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_1240._8_8_) << 0x40,auVar16);
        local_18c0 = 0x3f8000003f800000;
        uStack_18b8 = 0x3f8000003f800000;
        uStack_18b0 = 0x3f8000003f800000;
        uStack_18a8 = 0x3f8000003f800000;
        local_1840._0_8_ = auVar6._0_8_;
        local_1200 = local_1840._0_8_;
        local_1840._8_8_ = auVar6._8_8_;
        uStack_11f8 = local_1840._8_8_;
        local_1840._16_8_ = auVar6._16_8_;
        uStack_11f0 = local_1840._16_8_;
        local_1840._24_8_ = auVar6._24_8_;
        uStack_11e8 = local_1840._24_8_;
        local_1220 = 0x42b0c0a542b0c0a5;
        uStack_1218 = 0x42b0c0a542b0c0a5;
        uStack_1210 = 0x42b0c0a542b0c0a5;
        uStack_1208 = 0x42b0c0a542b0c0a5;
        auVar23._8_8_ = 0x42b0c0a542b0c0a5;
        auVar23._0_8_ = 0x42b0c0a542b0c0a5;
        auVar23._16_8_ = 0x42b0c0a542b0c0a5;
        auVar23._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar23);
        local_1840._0_8_ = auVar6._0_8_;
        local_1180 = local_1840._0_8_;
        local_1840._8_8_ = auVar6._8_8_;
        uStack_1178 = local_1840._8_8_;
        local_1840._16_8_ = auVar6._16_8_;
        uStack_1170 = local_1840._16_8_;
        local_1840._24_8_ = auVar6._24_8_;
        uStack_1168 = local_1840._24_8_;
        local_11a0 = 0xc2b0c0a5c2b0c0a5;
        uStack_1198 = 0xc2b0c0a5c2b0c0a5;
        uStack_1190 = 0xc2b0c0a5c2b0c0a5;
        uStack_1188 = 0xc2b0c0a5c2b0c0a5;
        auVar25._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar25._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar25._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar25);
        local_1840._0_8_ = auVar4._0_8_;
        uVar10 = local_1840._0_8_;
        local_1840._8_8_ = auVar4._8_8_;
        uVar11 = local_1840._8_8_;
        local_1840._16_8_ = auVar4._16_8_;
        uVar12 = local_1840._16_8_;
        local_1840._24_8_ = auVar4._24_8_;
        uVar13 = local_1840._24_8_;
        local_14e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_14d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_14d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_14c8 = 0x3fb8aa3b3fb8aa3b;
        local_14c0._0_4_ = auVar4._0_4_;
        local_14c0._4_4_ = auVar4._4_4_;
        uStack_14b8._0_4_ = auVar4._8_4_;
        uStack_14b8._4_4_ = auVar4._12_4_;
        uStack_14b0._0_4_ = auVar4._16_4_;
        uStack_14b0._4_4_ = auVar4._20_4_;
        uStack_14a8._0_4_ = auVar4._24_4_;
        uStack_14a8._4_4_ = auVar4._28_4_;
        local_1880._4_4_ = local_14c0._4_4_ * 1.442695;
        local_1880._0_4_ = (float)local_14c0 * 1.442695;
        uStack_1878._0_4_ = (float)uStack_14b8 * 1.442695;
        uStack_1878._4_4_ = uStack_14b8._4_4_ * 1.442695;
        uStack_1870._0_4_ = (float)uStack_14b0 * 1.442695;
        uStack_1870._4_4_ = uStack_14b0._4_4_ * 1.442695;
        auVar58 = _local_1880;
        uStack_1868._0_4_ = (float)uStack_14a8 * 1.442695;
        uStack_1868._4_4_ = uStack_14a8._4_4_;
        auVar6 = _local_1880;
        local_12c0 = local_1880;
        uStack_12b8 = uStack_1878;
        uStack_1870 = auVar58._16_8_;
        uStack_12b0 = uStack_1870;
        uStack_1868 = auVar6._24_8_;
        uStack_12a8 = uStack_1868;
        local_1420 = 0x3f0000003f000000;
        uStack_1418 = 0x3f0000003f000000;
        uStack_1410 = 0x3f0000003f000000;
        uStack_1408 = 0x3f0000003f000000;
        local_1880._4_4_ = local_14c0._4_4_ * 1.442695 + 0.5;
        local_1880._0_4_ = (float)local_14c0 * 1.442695 + 0.5;
        uStack_1878._0_4_ = (float)uStack_14b8 * 1.442695 + 0.5;
        uStack_1878._4_4_ = uStack_14b8._4_4_ * 1.442695 + 0.5;
        uStack_1870._0_4_ = (float)uStack_14b0 * 1.442695 + 0.5;
        uStack_1870._4_4_ = uStack_14b0._4_4_ * 1.442695 + 0.5;
        uStack_1868._0_4_ = (float)uStack_14a8 * 1.442695 + 0.5;
        uStack_1868._4_4_ = uStack_14a8._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1880,1);
        auVar6 = vcmpps_avx(_local_1880,auVar5,1);
        local_18e0._0_8_ = auVar6._0_8_;
        local_1100 = local_18e0._0_8_;
        local_18e0._8_8_ = auVar6._8_8_;
        uStack_10f8 = local_18e0._8_8_;
        local_18e0._16_8_ = auVar6._16_8_;
        uStack_10f0 = local_18e0._16_8_;
        local_18e0._24_8_ = auVar6._24_8_;
        uStack_10e8 = local_18e0._24_8_;
        local_1120 = 0x3f8000003f800000;
        uStack_1118 = 0x3f8000003f800000;
        uStack_1110 = 0x3f8000003f800000;
        uStack_1108 = 0x3f8000003f800000;
        auVar27._8_8_ = 0x3f8000003f800000;
        auVar27._0_8_ = 0x3f8000003f800000;
        auVar27._16_8_ = 0x3f8000003f800000;
        auVar27._24_8_ = 0x3f8000003f800000;
        local_18e0 = vandps_avx(auVar6,auVar27);
        local_1860 = auVar5._0_8_;
        local_1780 = local_1860;
        uStack_1858 = auVar5._8_8_;
        uStack_1778 = uStack_1858;
        uStack_1850 = auVar5._16_8_;
        uStack_1770 = uStack_1850;
        uStack_1848 = auVar5._24_8_;
        uStack_1768 = uStack_1848;
        local_17a0 = local_18e0._0_8_;
        uStack_1798 = local_18e0._8_8_;
        uStack_1790 = local_18e0._16_8_;
        uStack_1788 = local_18e0._24_8_;
        _local_1880 = vsubps_avx(auVar5,local_18e0);
        local_1520 = 0x3f3180003f318000;
        uStack_1518 = 0x3f3180003f318000;
        uStack_1510 = 0x3f3180003f318000;
        uStack_1508 = 0x3f3180003f318000;
        local_1500._0_4_ = local_1880._0_4_;
        local_1500._4_4_ = local_1880._4_4_;
        uStack_14f8._0_4_ = local_1880._8_4_;
        uStack_14f8._4_4_ = local_1880._12_4_;
        uStack_14f0._0_4_ = local_1880._16_4_;
        uStack_14f0._4_4_ = local_1880._20_4_;
        uStack_14e8._0_4_ = local_1880._24_4_;
        uStack_14e8._4_4_ = local_1880._28_4_;
        local_1860._4_4_ = local_1500._4_4_ * 0.6933594;
        local_1860._0_4_ = (float)local_1500 * 0.6933594;
        uStack_1858._0_4_ = (float)uStack_14f8 * 0.6933594;
        uStack_1858._4_4_ = uStack_14f8._4_4_ * 0.6933594;
        uStack_1850._0_4_ = (float)uStack_14f0 * 0.6933594;
        uStack_1850._4_4_ = uStack_14f0._4_4_ * 0.6933594;
        auVar58 = _local_1860;
        uStack_1848._0_4_ = (float)uStack_14e8 * 0.6933594;
        uStack_1848._4_4_ = uStack_14e8._4_4_;
        auVar5 = _local_1860;
        local_1540 = local_1880;
        uStack_1538 = uStack_1878;
        uStack_1530 = uStack_1870;
        uStack_1528 = uStack_1868;
        local_1560 = 0xb95e8083b95e8083;
        uStack_1558 = 0xb95e8083b95e8083;
        uStack_1550 = 0xb95e8083b95e8083;
        uStack_1548 = 0xb95e8083b95e8083;
        local_17c0 = local_1840._0_8_;
        uStack_17b8 = local_1840._8_8_;
        uStack_17b0 = local_1840._16_8_;
        uStack_17a8 = local_1840._24_8_;
        local_17e0 = local_1860;
        uStack_17d8 = uStack_1858;
        uStack_1850 = auVar58._16_8_;
        uStack_17d0 = uStack_1850;
        uStack_1848 = auVar5._24_8_;
        uStack_17c8 = uStack_1848;
        auVar22._16_8_ = uStack_1850;
        auVar22._0_16_ = _local_1860;
        auVar22._24_8_ = uStack_1848;
        auVar6 = vsubps_avx(auVar4,auVar22);
        local_1840._0_8_ = auVar6._0_8_;
        local_1800 = local_1840._0_8_;
        local_1840._8_8_ = auVar6._8_8_;
        uStack_17f8 = local_1840._8_8_;
        local_1840._16_8_ = auVar6._16_8_;
        uStack_17f0 = local_1840._16_8_;
        local_1840._24_8_ = auVar6._24_8_;
        uStack_17e8 = local_1840._24_8_;
        local_1820 = CONCAT44(local_1500._4_4_ * -0.00021219444,(float)local_1500 * -0.00021219444);
        uStack_1818 = CONCAT44(uStack_14f8._4_4_ * -0.00021219444,
                               (float)uStack_14f8 * -0.00021219444);
        uStack_1810 = CONCAT44(uStack_14f0._4_4_ * -0.00021219444,
                               (float)uStack_14f0 * -0.00021219444);
        uStack_1808 = CONCAT44(uStack_14e8._4_4_,(float)uStack_14e8 * -0.00021219444);
        auVar21._8_8_ = uStack_1818;
        auVar21._0_8_ = local_1820;
        auVar21._16_8_ = uStack_1810;
        auVar21._24_8_ = uStack_1808;
        local_1840 = vsubps_avx(auVar6,auVar21);
        local_15a0 = local_1840._0_8_;
        uStack_1598 = local_1840._8_8_;
        uStack_1590 = local_1840._16_8_;
        uStack_1588 = local_1840._24_8_;
        local_1580._0_4_ = local_1840._0_4_;
        local_1580._4_4_ = local_1840._4_4_;
        uStack_1578._0_4_ = local_1840._8_4_;
        uStack_1578._4_4_ = local_1840._12_4_;
        uStack_1570._0_4_ = local_1840._16_4_;
        uStack_1570._4_4_ = local_1840._20_4_;
        uStack_1568._0_4_ = local_1840._24_4_;
        uStack_1568._4_4_ = local_1840._28_4_;
        fStack_18e4 = uStack_1568._4_4_;
        local_1900 = (float)local_1580 * (float)local_1580;
        fStack_18fc = local_1580._4_4_ * local_1580._4_4_;
        fStack_18f8 = (float)uStack_1578 * (float)uStack_1578;
        fStack_18f4 = uStack_1578._4_4_ * uStack_1578._4_4_;
        fStack_18f0 = (float)uStack_1570 * (float)uStack_1570;
        fStack_18ec = uStack_1570._4_4_ * uStack_1570._4_4_;
        fStack_18e8 = (float)uStack_1568 * (float)uStack_1568;
        local_15c0 = 0x3950696739506967;
        uStack_15b8 = 0x3950696739506967;
        uStack_15b0 = 0x3950696739506967;
        uStack_15a8 = 0x3950696739506967;
        local_15e0 = local_1840._0_8_;
        uStack_15d8 = local_1840._8_8_;
        uStack_15d0 = local_1840._16_8_;
        uStack_15c8 = local_1840._24_8_;
        local_1920 = CONCAT44(local_1580._4_4_ * 0.00019875691,(float)local_1580 * 0.00019875691);
        uStack_1918 = CONCAT44(uStack_1578._4_4_ * 0.00019875691,(float)uStack_1578 * 0.00019875691)
        ;
        uStack_1910 = CONCAT44(uStack_1570._4_4_ * 0.00019875691,(float)uStack_1570 * 0.00019875691)
        ;
        uStack_1908 = CONCAT44(0x39506967,(float)uStack_1568 * 0.00019875691);
        local_1300 = local_1920;
        uStack_12f8 = uStack_1918;
        uStack_12f0 = uStack_1910;
        uStack_12e8 = uStack_1908;
        local_1320 = 0x3ab743ce3ab743ce;
        uStack_1318 = 0x3ab743ce3ab743ce;
        uStack_1310 = 0x3ab743ce3ab743ce;
        uStack_1308 = 0x3ab743ce3ab743ce;
        local_20a0 = (float)local_1580 * 0.00019875691 + 0.0013981999;
        fStack_209c = local_1580._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2098 = (float)uStack_1578 * 0.00019875691 + 0.0013981999;
        fStack_2094 = uStack_1578._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2090 = (float)uStack_1570 * 0.00019875691 + 0.0013981999;
        fStack_208c = uStack_1570._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2088 = (float)uStack_1568 * 0.00019875691 + 0.0013981999;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3ad150fb,fStack_2088);
        local_1600 = local_1920;
        uStack_15f8 = uStack_1918;
        uStack_15f0 = uStack_1910;
        uStack_15e8 = uStack_1908;
        local_1620 = local_1840._0_8_;
        uStack_1618 = local_1840._8_8_;
        uStack_1610 = local_1840._16_8_;
        uStack_1608 = local_1840._24_8_;
        local_20a0 = local_20a0 * (float)local_1580;
        fStack_209c = fStack_209c * local_1580._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_1578;
        fStack_2094 = fStack_2094 * uStack_1578._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_1570;
        fStack_208c = fStack_208c * uStack_1570._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_1568;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3ad150fb,fStack_2088);
        local_1340 = local_1920;
        uStack_1338 = uStack_1918;
        uStack_1330 = uStack_1910;
        uStack_1328 = uStack_1908;
        local_1360 = 0x3c0889083c088908;
        uStack_1358 = 0x3c0889083c088908;
        uStack_1350 = 0x3c0889083c088908;
        uStack_1348 = 0x3c0889083c088908;
        local_20a0 = local_20a0 + 0.008333452;
        fStack_209c = fStack_209c + 0.008333452;
        fStack_2098 = fStack_2098 + 0.008333452;
        fStack_2094 = fStack_2094 + 0.008333452;
        fStack_2090 = fStack_2090 + 0.008333452;
        fStack_208c = fStack_208c + 0.008333452;
        fStack_2088 = fStack_2088 + 0.008333452;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3c22b327,fStack_2088);
        local_1640 = local_1920;
        uStack_1638 = uStack_1918;
        uStack_1630 = uStack_1910;
        uStack_1628 = uStack_1908;
        local_1660 = local_1840._0_8_;
        uStack_1658 = local_1840._8_8_;
        uStack_1650 = local_1840._16_8_;
        uStack_1648 = local_1840._24_8_;
        local_20a0 = local_20a0 * (float)local_1580;
        fStack_209c = fStack_209c * local_1580._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_1578;
        fStack_2094 = fStack_2094 * uStack_1578._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_1570;
        fStack_208c = fStack_208c * uStack_1570._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_1568;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3c22b327,fStack_2088);
        local_1380 = local_1920;
        uStack_1378 = uStack_1918;
        uStack_1370 = uStack_1910;
        uStack_1368 = uStack_1908;
        local_13a0 = 0x3d2aa9c13d2aa9c1;
        uStack_1398 = 0x3d2aa9c13d2aa9c1;
        uStack_1390 = 0x3d2aa9c13d2aa9c1;
        uStack_1388 = 0x3d2aa9c13d2aa9c1;
        local_20a0 = local_20a0 + 0.041665796;
        fStack_209c = fStack_209c + 0.041665796;
        fStack_2098 = fStack_2098 + 0.041665796;
        fStack_2094 = fStack_2094 + 0.041665796;
        fStack_2090 = fStack_2090 + 0.041665796;
        fStack_208c = fStack_208c + 0.041665796;
        fStack_2088 = fStack_2088 + 0.041665796;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3d53568b,fStack_2088);
        local_1680 = local_1920;
        uStack_1678 = uStack_1918;
        uStack_1670 = uStack_1910;
        uStack_1668 = uStack_1908;
        local_16a0 = local_1840._0_8_;
        uStack_1698 = local_1840._8_8_;
        uStack_1690 = local_1840._16_8_;
        uStack_1688 = local_1840._24_8_;
        local_20a0 = local_20a0 * (float)local_1580;
        fStack_209c = fStack_209c * local_1580._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_1578;
        fStack_2094 = fStack_2094 * uStack_1578._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_1570;
        fStack_208c = fStack_208c * uStack_1570._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_1568;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3d53568b,fStack_2088);
        local_13c0 = local_1920;
        uStack_13b8 = uStack_1918;
        uStack_13b0 = uStack_1910;
        uStack_13a8 = uStack_1908;
        local_13e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_13d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_13d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_13c8 = 0x3e2aaaaa3e2aaaaa;
        local_20a0 = local_20a0 + 0.16666666;
        fStack_209c = fStack_209c + 0.16666666;
        fStack_2098 = fStack_2098 + 0.16666666;
        fStack_2094 = fStack_2094 + 0.16666666;
        fStack_2090 = fStack_2090 + 0.16666666;
        fStack_208c = fStack_208c + 0.16666666;
        fStack_2088 = fStack_2088 + 0.16666666;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3e5f804d,fStack_2088);
        local_16c0 = local_1920;
        uStack_16b8 = uStack_1918;
        uStack_16b0 = uStack_1910;
        uStack_16a8 = uStack_1908;
        local_16e0 = local_1840._0_8_;
        uStack_16d8 = local_1840._8_8_;
        uStack_16d0 = local_1840._16_8_;
        uStack_16c8 = local_1840._24_8_;
        local_20a0 = local_20a0 * (float)local_1580;
        fStack_209c = fStack_209c * local_1580._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_1578;
        fStack_2094 = fStack_2094 * uStack_1578._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_1570;
        fStack_208c = fStack_208c * uStack_1570._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_1568;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3e5f804d,fStack_2088);
        local_1400 = local_1920;
        uStack_13f8 = uStack_1918;
        uStack_13f0 = uStack_1910;
        uStack_13e8 = uStack_1908;
        local_20a0 = local_20a0 + 0.5;
        fStack_209c = fStack_209c + 0.5;
        fStack_2098 = fStack_2098 + 0.5;
        fStack_2094 = fStack_2094 + 0.5;
        fStack_2090 = fStack_2090 + 0.5;
        fStack_208c = fStack_208c + 0.5;
        fStack_2088 = fStack_2088 + 0.5;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3f37e013,fStack_2088);
        local_1700 = local_1920;
        uStack_16f8 = uStack_1918;
        uStack_16f0 = uStack_1910;
        uStack_16e8 = uStack_1908;
        local_1720 = CONCAT44(fStack_18fc,local_1900);
        uStack_1718 = CONCAT44(fStack_18f4,fStack_18f8);
        uStack_1710 = CONCAT44(fStack_18ec,fStack_18f0);
        uStack_1708 = CONCAT44(uStack_1568._4_4_,fStack_18e8);
        local_20a0 = local_20a0 * local_1900;
        fStack_209c = fStack_209c * fStack_18fc;
        fStack_2098 = fStack_2098 * fStack_18f8;
        fStack_2094 = fStack_2094 * fStack_18f4;
        fStack_2090 = fStack_2090 * fStack_18f0;
        fStack_208c = fStack_208c * fStack_18ec;
        fStack_2088 = fStack_2088 * fStack_18e8;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(0x3f37e013,fStack_2088);
        local_1440 = local_1920;
        uStack_1438 = uStack_1918;
        uStack_1430 = uStack_1910;
        uStack_1428 = uStack_1908;
        local_1460 = local_1840._0_8_;
        uStack_1458 = local_1840._8_8_;
        uStack_1450 = local_1840._16_8_;
        uStack_1448 = local_1840._24_8_;
        local_20a0 = local_20a0 + (float)local_1580;
        fStack_209c = fStack_209c + local_1580._4_4_;
        fStack_2098 = fStack_2098 + (float)uStack_1578;
        fStack_2094 = fStack_2094 + uStack_1578._4_4_;
        fStack_2090 = fStack_2090 + (float)uStack_1570;
        fStack_208c = fStack_208c + uStack_1570._4_4_;
        fStack_2088 = fStack_2088 + (float)uStack_1568;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(uStack_1568._4_4_ + 0.71826285,fStack_2088);
        local_1480 = local_1920;
        uStack_1478 = uStack_1918;
        uStack_1470 = uStack_1910;
        uStack_1468 = uStack_1908;
        local_14a0 = 0x3f8000003f800000;
        uStack_1498 = 0x3f8000003f800000;
        uStack_1490 = 0x3f8000003f800000;
        uStack_1488 = 0x3f8000003f800000;
        local_20a0 = local_20a0 + 1.0;
        fStack_209c = fStack_209c + 1.0;
        fStack_2098 = fStack_2098 + 1.0;
        fStack_2094 = fStack_2094 + 1.0;
        fStack_2090 = fStack_2090 + 1.0;
        fStack_208c = fStack_208c + 1.0;
        fStack_2088 = fStack_2088 + 1.0;
        fStack_2084 = uStack_1568._4_4_ + 0.71826285 + 1.0;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(fStack_2084,fStack_2088);
        local_10a0 = local_1880;
        uStack_1098 = uStack_1878;
        uStack_1090 = uStack_1870;
        uStack_1088 = uStack_1868;
        local_18a0 = CONCAT44((int)local_1500._4_4_,(int)(float)local_1500);
        uStack_1898 = CONCAT44((int)uStack_14f8._4_4_,(int)(float)uStack_14f8);
        uStack_1890 = CONCAT44((int)uStack_14f0._4_4_,(int)(float)uStack_14f0);
        uStack_1888 = CONCAT44((int)uStack_14e8._4_4_,(int)(float)uStack_14e8);
        local_f80 = local_18a0;
        uStack_f78 = uStack_1898;
        uStack_f70 = uStack_1890;
        uStack_f68 = uStack_1888;
        local_fa0 = 0x7f0000007f;
        uStack_f98 = 0x7f0000007f;
        uStack_f90 = 0x7f0000007f;
        uStack_f88 = 0x7f0000007f;
        local_1020 = local_18a0;
        uStack_1018 = uStack_1898;
        uStack_1010 = uStack_1890;
        uStack_1008 = uStack_1888;
        local_1040 = 0x7f0000007f;
        uStack_1038 = 0x7f0000007f;
        uStack_1030 = 0x7f0000007f;
        uStack_1028 = 0x7f0000007f;
        local_fd0 = 0x7f0000007f;
        uStack_fc8 = 0x7f0000007f;
        local_fe0 = 0x7f0000007f;
        uStack_fd8 = 0x7f0000007f;
        local_c20 = local_18a0;
        uStack_c18 = uStack_1898;
        local_c30 = 0x7f0000007f;
        uStack_c28 = 0x7f0000007f;
        auVar33._8_8_ = uStack_1898;
        auVar33._0_8_ = local_18a0;
        auVar32._8_8_ = 0x7f0000007f;
        auVar32._0_8_ = 0x7f0000007f;
        local_fb0 = vpaddd_avx(auVar33,auVar32);
        local_c40 = uStack_1890;
        uStack_c38 = uStack_1888;
        local_c50 = 0x7f0000007f;
        uStack_c48 = 0x7f0000007f;
        auVar31._8_8_ = uStack_1888;
        auVar31._0_8_ = uStack_1890;
        auVar30._8_8_ = 0x7f0000007f;
        auVar30._0_8_ = 0x7f0000007f;
        local_fc0 = vpaddd_avx(auVar31,auVar30);
        local_1060 = local_fb0._0_8_;
        uStack_1058 = local_fb0._8_8_;
        uStack_1050 = local_fc0._0_8_;
        uStack_1048 = local_fc0._8_8_;
        local_1000 = local_fb0._0_8_;
        uStack_ff8 = local_fb0._8_8_;
        uStack_ff0 = local_fc0._0_8_;
        uStack_fe8 = local_fc0._8_8_;
        local_dc0 = local_fb0._0_8_;
        uStack_db8 = local_fb0._8_8_;
        uStack_db0 = local_fc0._0_8_;
        uStack_da8 = local_fc0._8_8_;
        local_dc4 = 0x17;
        local_e40 = local_fb0._0_8_;
        uStack_e38 = local_fb0._8_8_;
        uStack_e30 = local_fc0._0_8_;
        uStack_e28 = local_fc0._8_8_;
        local_ba0 = local_fb0._0_8_;
        uStack_b98 = local_fb0._8_8_;
        local_ba4 = 0x17;
        local_de0 = vpslld_avx(local_fb0,ZEXT416(0x17));
        local_bc0 = local_fc0._0_8_;
        uStack_bb8 = local_fc0._8_8_;
        local_bc4 = 0x17;
        local_df0 = vpslld_avx(local_fc0,ZEXT416(0x17));
        local_e60 = local_de0._0_8_;
        uStack_e58 = local_de0._8_8_;
        uStack_e50 = local_df0._0_8_;
        uStack_e48 = local_df0._8_8_;
        local_e20 = local_de0._0_8_;
        uStack_e18 = local_de0._8_8_;
        uStack_e10 = local_df0._0_8_;
        uStack_e08 = local_df0._8_8_;
        local_18a0 = local_de0._0_8_;
        uStack_1898 = local_de0._8_8_;
        uStack_1890 = local_df0._0_8_;
        uStack_1888 = local_df0._8_8_;
        local_ce0 = local_de0._0_8_;
        uStack_cd8 = local_de0._8_8_;
        uStack_cd0 = local_df0._0_8_;
        uStack_cc8 = local_df0._8_8_;
        local_1940 = local_de0._0_8_;
        uStack_1938 = local_de0._8_8_;
        uStack_1930 = local_df0._0_8_;
        uStack_1928 = local_df0._8_8_;
        local_1740 = local_1920;
        uStack_1738 = uStack_1918;
        uStack_1730 = uStack_1910;
        uStack_1728 = uStack_1908;
        local_1760._0_4_ = local_de0._0_4_;
        local_1760._4_4_ = local_de0._4_4_;
        uStack_1758._0_4_ = local_de0._8_4_;
        uStack_1758._4_4_ = local_de0._12_4_;
        uStack_1750._0_4_ = local_df0._0_4_;
        uStack_1750._4_4_ = local_df0._4_4_;
        uStack_1748._0_4_ = local_df0._8_4_;
        local_20a0 = local_20a0 * (float)local_1760;
        fStack_209c = fStack_209c * local_1760._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_1758;
        fStack_2094 = fStack_2094 * uStack_1758._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_1750;
        fStack_208c = fStack_208c * uStack_1750._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_1748;
        local_1920 = CONCAT44(fStack_209c,local_20a0);
        uStack_1918 = CONCAT44(fStack_2094,fStack_2098);
        uStack_1910 = CONCAT44(fStack_208c,fStack_2090);
        uStack_1908 = CONCAT44(fStack_2084,fStack_2088);
        local_2020 = local_1920;
        uStack_2018 = uStack_1918;
        uStack_2010 = uStack_1910;
        uStack_2008 = uStack_1908;
        local_2000._0_4_ = local_2220._0_4_;
        local_2000._4_4_ = local_2220._4_4_;
        uStack_1ff8._0_4_ = local_2220._8_4_;
        uStack_1ff8._4_4_ = local_2220._12_4_;
        uStack_1ff0._0_4_ = auStack_2210._0_4_;
        uStack_1ff0._4_4_ = auStack_2210._4_4_;
        uStack_1fe8._0_4_ = auStack_2210._8_4_;
        uStack_1fe8._4_4_ = auStack_2210._12_4_;
        local_20a0 = (float)local_2000 + local_20a0;
        fStack_209c = local_2000._4_4_ + fStack_209c;
        fStack_2098 = (float)uStack_1ff8 + fStack_2098;
        fStack_2094 = uStack_1ff8._4_4_ + fStack_2094;
        fStack_2090 = (float)uStack_1ff0 + fStack_2090;
        fStack_208c = uStack_1ff0._4_4_ + fStack_208c;
        fStack_2088 = (float)uStack_1fe8 + fStack_2088;
        fStack_2084 = uStack_1fe8._4_4_ + fStack_2084;
        auVar18._16_8_ = auStack_2210._0_8_;
        auVar18._0_16_ = local_2220;
        auVar18._24_8_ = auStack_2210._8_8_;
        auVar17._4_4_ = fStack_209c;
        auVar17._0_4_ = local_20a0;
        auVar17._8_4_ = fStack_2098;
        auVar17._12_4_ = fStack_2094;
        auVar17._16_4_ = fStack_2090;
        auVar17._20_4_ = fStack_208c;
        auVar17._24_4_ = fStack_2088;
        auVar17._28_4_ = fStack_2084;
        _local_2480 = vdivps_avx(auVar18,auVar17);
        local_24a0 = local_2120._0_8_;
        uStack_2498 = local_2120._8_8_;
        uStack_2490 = auStack_2110._0_8_;
        uStack_2488 = auStack_2110._8_8_;
        local_2500 = (float)local_2480._0_4_ * (float)local_2460;
        fStack_24fc = (float)local_2480._4_4_ * local_2460._4_4_;
        fStack_24f8 = fStack_2478 * (float)uStack_2458;
        fStack_24f4 = fStack_2474 * uStack_2458._4_4_;
        fStack_24f0 = fStack_2470 * (float)uStack_2450;
        fStack_24ec = fStack_246c * uStack_2450._4_4_;
        uStack_24e4 = local_2480._28_4_;
        fStack_24e8 = fStack_2468 * (float)uStack_2448;
        local_2520 = local_2160._0_8_;
        uStack_2518 = local_2160._8_8_;
        uStack_2510 = auStack_2150._0_8_;
        uStack_2508 = auStack_2150._8_8_;
        auVar15._4_4_ = fStack_24fc;
        auVar15._0_4_ = local_2500;
        auVar15._8_4_ = fStack_24f8;
        auVar15._12_4_ = fStack_24f4;
        auVar15._16_4_ = fStack_24f0;
        auVar15._20_4_ = fStack_24ec;
        auVar15._24_4_ = fStack_24e8;
        auVar15._28_4_ = uStack_24e4;
        auVar14._16_8_ = auStack_2150._0_8_;
        auVar14._0_16_ = local_2160;
        auVar14._24_8_ = auStack_2150._8_8_;
        local_2800 = vsubps_avx(auVar15,auVar14);
        local_25e8 = local_2770;
        local_2620 = local_2800._0_8_;
        uStack_2618 = local_2800._8_8_;
        uStack_2610 = local_2800._16_8_;
        uStack_2608 = local_2800._24_8_;
        *local_2770 = local_2800;
        local_2770 = local_2770 + 1;
        local_2460 = local_2120._0_8_;
        uStack_2458 = local_2120._8_8_;
        uStack_2450 = auStack_2110._0_8_;
        uStack_2448 = auStack_2110._8_8_;
        local_2440 = uVar7;
        uStack_2438 = uVar8;
        uStack_2430 = uVar9;
        uStack_2428 = uStack_2668;
        local_21fc = local_2200;
        local_21f8 = local_2200;
        local_21f4 = local_2200;
        local_21f0 = local_2200;
        local_21ec = local_2200;
        local_21e8 = local_2200;
        local_21e4 = local_2200;
        local_2140 = in_stack_ffffffffffffd6d4;
        local_213c = in_stack_ffffffffffffd6d4;
        local_2138 = in_stack_ffffffffffffd6d4;
        local_2134 = in_stack_ffffffffffffd6d4;
        local_2130 = in_stack_ffffffffffffd6d4;
        local_212c = in_stack_ffffffffffffd6d4;
        local_2128 = in_stack_ffffffffffffd6d4;
        local_2124 = in_stack_ffffffffffffd6d4;
        local_20fc = local_2100;
        local_20f8 = local_2100;
        local_20f4 = local_2100;
        local_20f0 = local_2100;
        local_20ec = local_2100;
        local_20e8 = local_2100;
        local_20e4 = local_2100;
        local_2000 = local_2080;
        uStack_1ff8 = uStack_2078;
        uStack_1ff0 = uStack_2070;
        uStack_1fe8 = uStack_2068;
        _local_1860 = auVar5;
        local_1760 = local_de0._0_8_;
        uStack_1758 = local_de0._8_8_;
        uStack_1750 = local_df0._0_8_;
        uStack_1748 = local_df0._8_8_;
        local_1580 = local_15a0;
        uStack_1578 = uStack_1598;
        uStack_1570 = uStack_1590;
        uStack_1568 = uStack_1588;
        local_1500 = local_1880;
        uStack_14f8 = uStack_1878;
        uStack_14f0 = uStack_1870;
        uStack_14e8 = uStack_1868;
        local_14c0 = uVar10;
        uStack_14b8 = uVar11;
        uStack_14b0 = uVar12;
        uStack_14a8 = uVar13;
        local_12e0 = local_1420;
        uStack_12d8 = uStack_1418;
        uStack_12d0 = uStack_1410;
        uStack_12c8 = uStack_1408;
        local_1240 = local_12a0;
      }
    }
  }
  else if (local_2764 == 4) {
    local_2764 = 4;
    for (local_2804 = 0; local_2804 < local_275c; local_2804 = local_2804 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd6d4,in_stack_ffffffffffffd6d0),
                         (int)((ulong)in_stack_ffffffffffffd6c8 >> 0x20));
      in_stack_ffffffffffffd6c8 =
           (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_2858);
      ncnn::Mat::~Mat((Mat *)0x5193de);
      local_2810 = in_stack_ffffffffffffd6c8;
      for (local_285c = 0; local_285c < local_2760; local_285c = local_285c + 1) {
        local_25d8 = local_2810;
        local_2580 = *(undefined8 *)*local_2810;
        uStack_2578 = *(undefined8 *)(*local_2810 + 8);
        local_b54 = 0x3f800000;
        local_b70 = 0x3f800000;
        local_2590 = 0x3f8000003f800000;
        uStack_2588 = 0x3f8000003f800000;
        local_b74 = 0x40000000;
        local_b90 = 0x40000000;
        local_25a0 = 0x4000000040000000;
        uStack_2598 = 0x4000000040000000;
        local_aa0._0_4_ = (float)local_2580;
        local_aa0._4_4_ = (float)((ulong)local_2580 >> 0x20);
        uStack_a98._0_4_ = (float)uStack_2578;
        uStack_a98._4_4_ = (float)((ulong)uStack_2578 >> 0x20);
        local_a40 = (float)local_aa0 * 2.0;
        fStack_a3c = local_aa0._4_4_ * 2.0;
        fStack_a38 = (float)uStack_a98 * 2.0;
        fStack_a34 = uStack_a98._4_4_ * 2.0;
        local_a14 = 0x3f800000;
        local_a30 = 0x3f800000;
        local_a50 = 0x3f8000003f800000;
        uStack_a48 = 0x3f8000003f800000;
        local_960._8_8_ = 0x3f8000003f800000;
        local_960._0_8_ = 0x3f8000003f800000;
        local_1f0 = ZEXT816(0) << 0x20;
        local_a00 = 0;
        local_1c0._8_8_ = SUB168(ZEXT816(0),4);
        uStack_9f8 = local_1c0._8_8_;
        local_a10 = CONCAT44(fStack_a3c,local_a40);
        uStack_a08 = CONCAT44(fStack_a34,fStack_a38);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_1c0._8_8_;
        auVar36._8_8_ = uStack_a08;
        auVar36._0_8_ = local_a10;
        auVar2 = vsubps_avx(auVar59 << 0x40,auVar36);
        local_540 = 0x3f8000003f800000;
        uStack_538 = 0x3f8000003f800000;
        local_500._0_8_ = auVar2._0_8_;
        local_1a0 = local_500._0_8_;
        local_500._8_8_ = auVar2._8_8_;
        uStack_198 = local_500._8_8_;
        local_1b0 = 0x42b0c0a542b0c0a5;
        uStack_1a8 = 0x42b0c0a542b0c0a5;
        auVar48._8_8_ = 0x42b0c0a542b0c0a5;
        auVar48._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar48);
        local_500._0_8_ = auVar2._0_8_;
        local_160 = local_500._0_8_;
        local_500._8_8_ = auVar2._8_8_;
        uStack_158 = local_500._8_8_;
        local_170 = 0xc2b0c0a5c2b0c0a5;
        uStack_168 = 0xc2b0c0a5c2b0c0a5;
        auVar50._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar50);
        local_500._0_8_ = auVar3._0_8_;
        uVar7 = local_500._0_8_;
        local_500._8_8_ = auVar3._8_8_;
        uVar8 = local_500._8_8_;
        local_310 = 0x3fb8aa3b3fb8aa3b;
        uStack_308 = 0x3fb8aa3b3fb8aa3b;
        local_300._0_4_ = auVar3._0_4_;
        local_300._4_4_ = auVar3._4_4_;
        uStack_2f8._0_4_ = auVar3._8_4_;
        uStack_2f8._4_4_ = auVar3._12_4_;
        local_520._4_4_ = local_300._4_4_ * 1.442695;
        local_520._0_4_ = (float)local_300 * 1.442695;
        uStack_518._0_4_ = (float)uStack_2f8 * 1.442695;
        uStack_518._4_4_ = uStack_2f8._4_4_ * 1.442695;
        local_200 = local_520;
        uStack_1f8 = uStack_518;
        local_2b0 = 0x3f0000003f000000;
        uStack_2a8 = 0x3f0000003f000000;
        local_520._0_4_ = (float)local_300 * 1.442695 + 0.5;
        local_520._4_4_ = local_300._4_4_ * 1.442695 + 0.5;
        fVar63 = (float)uStack_2f8 * 1.442695 + 0.5;
        fVar64 = uStack_2f8._4_4_ * 1.442695 + 0.5;
        uStack_518._0_4_ = fVar63;
        uStack_518._4_4_ = fVar64;
        local_120 = local_520;
        uStack_118 = uStack_518;
        local_530._4_4_ = (int)(float)local_520._4_4_;
        local_530._0_4_ = (int)(float)local_520._0_4_;
        local_530._8_4_ = (int)fVar63;
        local_530._12_4_ = (int)fVar64;
        local_f0 = local_530._0_8_;
        uStack_e8 = local_530._8_8_;
        auVar52._8_8_ = local_530._8_8_;
        auVar52._0_8_ = local_530._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar52);
        local_510 = auVar1._0_8_;
        local_c0 = local_510;
        uStack_508 = auVar1._8_8_;
        uStack_b8 = uStack_508;
        local_d0 = local_520;
        uStack_c8 = uStack_518;
        auVar54._8_8_ = uStack_518;
        auVar54._0_8_ = local_520;
        auVar2 = vcmpps_avx(auVar54,auVar1,1);
        local_550._0_8_ = auVar2._0_8_;
        local_80 = local_550._0_8_;
        local_550._8_8_ = auVar2._8_8_;
        uStack_78 = local_550._8_8_;
        local_90 = 0x3f8000003f800000;
        uStack_88 = 0x3f8000003f800000;
        auVar56._8_8_ = 0x3f8000003f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        local_550 = vpand_avx(auVar2,auVar56);
        local_460 = local_510;
        uStack_458 = uStack_508;
        local_470 = local_550._0_8_;
        uStack_468 = local_550._8_8_;
        _local_520 = vsubps_avx(auVar1,local_550);
        local_330 = 0x3f3180003f318000;
        uStack_328 = 0x3f3180003f318000;
        local_320._0_4_ = local_520._0_4_;
        local_320._4_4_ = local_520._4_4_;
        uStack_318._0_4_ = local_520._8_4_;
        uStack_318._4_4_ = local_520._12_4_;
        local_510 = CONCAT44(local_320._4_4_ * 0.6933594,(float)local_320 * 0.6933594);
        uStack_508._0_4_ = (float)uStack_318 * 0.6933594;
        uStack_508._4_4_ = uStack_318._4_4_ * 0.6933594;
        local_340 = local_520;
        uStack_338 = uStack_518;
        local_350 = 0xb95e8083b95e8083;
        uStack_348 = 0xb95e8083b95e8083;
        local_480 = local_500._0_8_;
        uStack_478 = local_500._8_8_;
        local_490 = local_510;
        uStack_488 = uStack_508;
        auVar47._8_8_ = uStack_508;
        auVar47._0_8_ = local_510;
        auVar2 = vsubps_avx(auVar3,auVar47);
        local_500._0_8_ = auVar2._0_8_;
        local_4a0 = local_500._0_8_;
        local_500._8_8_ = auVar2._8_8_;
        uStack_498 = local_500._8_8_;
        local_4b0 = CONCAT44(local_320._4_4_ * -0.00021219444,(float)local_320 * -0.00021219444);
        uStack_4a8 = CONCAT44(uStack_318._4_4_ * -0.00021219444,(float)uStack_318 * -0.00021219444);
        auVar46._8_8_ = uStack_4a8;
        auVar46._0_8_ = local_4b0;
        local_500 = vsubps_avx(auVar2,auVar46);
        local_370 = local_500._0_8_;
        uStack_368 = local_500._8_8_;
        local_360._0_4_ = local_500._0_4_;
        local_360._4_4_ = local_500._4_4_;
        uStack_358._0_4_ = local_500._8_4_;
        uStack_358._4_4_ = local_500._12_4_;
        local_560 = (float)local_360 * (float)local_360;
        fStack_55c = local_360._4_4_ * local_360._4_4_;
        fStack_558 = (float)uStack_358 * (float)uStack_358;
        fStack_554 = uStack_358._4_4_ * uStack_358._4_4_;
        local_380 = 0x3950696739506967;
        uStack_378 = 0x3950696739506967;
        local_390 = local_500._0_8_;
        uStack_388 = local_500._8_8_;
        local_220 = CONCAT44(local_360._4_4_ * 0.00019875691,(float)local_360 * 0.00019875691);
        uStack_218 = CONCAT44(uStack_358._4_4_ * 0.00019875691,(float)uStack_358 * 0.00019875691);
        local_230 = 0x3ab743ce3ab743ce;
        uStack_228 = 0x3ab743ce3ab743ce;
        local_570 = (float)local_360 * 0.00019875691 + 0.0013981999;
        fStack_56c = local_360._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_568 = (float)uStack_358 * 0.00019875691 + 0.0013981999;
        fStack_564 = uStack_358._4_4_ * 0.00019875691 + 0.0013981999;
        local_3a0 = CONCAT44(fStack_56c,local_570);
        uStack_398 = CONCAT44(fStack_564,fStack_568);
        local_3b0 = local_500._0_8_;
        uStack_3a8 = local_500._8_8_;
        local_570 = local_570 * (float)local_360;
        fStack_56c = fStack_56c * local_360._4_4_;
        fStack_568 = fStack_568 * (float)uStack_358;
        fStack_564 = fStack_564 * uStack_358._4_4_;
        local_240 = CONCAT44(fStack_56c,local_570);
        uStack_238 = CONCAT44(fStack_564,fStack_568);
        local_250 = 0x3c0889083c088908;
        uStack_248 = 0x3c0889083c088908;
        local_570 = local_570 + 0.008333452;
        fStack_56c = fStack_56c + 0.008333452;
        fStack_568 = fStack_568 + 0.008333452;
        fStack_564 = fStack_564 + 0.008333452;
        local_3c0 = CONCAT44(fStack_56c,local_570);
        uStack_3b8 = CONCAT44(fStack_564,fStack_568);
        local_3d0 = local_500._0_8_;
        uStack_3c8 = local_500._8_8_;
        local_570 = local_570 * (float)local_360;
        fStack_56c = fStack_56c * local_360._4_4_;
        fStack_568 = fStack_568 * (float)uStack_358;
        fStack_564 = fStack_564 * uStack_358._4_4_;
        local_260 = CONCAT44(fStack_56c,local_570);
        uStack_258 = CONCAT44(fStack_564,fStack_568);
        local_270 = 0x3d2aa9c13d2aa9c1;
        uStack_268 = 0x3d2aa9c13d2aa9c1;
        local_570 = local_570 + 0.041665796;
        fStack_56c = fStack_56c + 0.041665796;
        fStack_568 = fStack_568 + 0.041665796;
        fStack_564 = fStack_564 + 0.041665796;
        local_3e0 = CONCAT44(fStack_56c,local_570);
        uStack_3d8 = CONCAT44(fStack_564,fStack_568);
        local_3f0 = local_500._0_8_;
        uStack_3e8 = local_500._8_8_;
        local_570 = local_570 * (float)local_360;
        fStack_56c = fStack_56c * local_360._4_4_;
        fStack_568 = fStack_568 * (float)uStack_358;
        fStack_564 = fStack_564 * uStack_358._4_4_;
        local_280 = CONCAT44(fStack_56c,local_570);
        uStack_278 = CONCAT44(fStack_564,fStack_568);
        local_290 = 0x3e2aaaaa3e2aaaaa;
        uStack_288 = 0x3e2aaaaa3e2aaaaa;
        local_570 = local_570 + 0.16666666;
        fStack_56c = fStack_56c + 0.16666666;
        fStack_568 = fStack_568 + 0.16666666;
        fStack_564 = fStack_564 + 0.16666666;
        local_400 = CONCAT44(fStack_56c,local_570);
        uStack_3f8 = CONCAT44(fStack_564,fStack_568);
        local_410 = local_500._0_8_;
        uStack_408 = local_500._8_8_;
        local_570 = local_570 * (float)local_360;
        fStack_56c = fStack_56c * local_360._4_4_;
        fStack_568 = fStack_568 * (float)uStack_358;
        fStack_564 = fStack_564 * uStack_358._4_4_;
        local_2a0 = CONCAT44(fStack_56c,local_570);
        uStack_298 = CONCAT44(fStack_564,fStack_568);
        local_570 = local_570 + 0.5;
        fStack_56c = fStack_56c + 0.5;
        fStack_568 = fStack_568 + 0.5;
        fStack_564 = fStack_564 + 0.5;
        local_420 = CONCAT44(fStack_56c,local_570);
        uStack_418 = CONCAT44(fStack_564,fStack_568);
        local_430 = CONCAT44(fStack_55c,local_560);
        uStack_428 = CONCAT44(fStack_554,fStack_558);
        local_570 = local_570 * local_560;
        fStack_56c = fStack_56c * fStack_55c;
        fStack_568 = fStack_568 * fStack_558;
        fStack_564 = fStack_564 * fStack_554;
        local_2c0 = CONCAT44(fStack_56c,local_570);
        uStack_2b8 = CONCAT44(fStack_564,fStack_568);
        local_2d0 = local_500._0_8_;
        uStack_2c8 = local_500._8_8_;
        local_570 = local_570 + (float)local_360;
        fStack_56c = fStack_56c + local_360._4_4_;
        fStack_568 = fStack_568 + (float)uStack_358;
        fStack_564 = fStack_564 + uStack_358._4_4_;
        local_2e0 = CONCAT44(fStack_56c,local_570);
        uStack_2d8 = CONCAT44(fStack_564,fStack_568);
        local_2f0 = 0x3f8000003f800000;
        uStack_2e8 = 0x3f8000003f800000;
        local_570 = local_570 + 1.0;
        fStack_56c = fStack_56c + 1.0;
        fStack_568 = fStack_568 + 1.0;
        fStack_564 = fStack_564 + 1.0;
        local_130 = local_520;
        uStack_128 = uStack_518;
        local_530._4_4_ = (int)local_320._4_4_;
        local_530._0_4_ = (int)(float)local_320;
        local_530._8_4_ = (int)(float)uStack_318;
        local_530._12_4_ = (int)uStack_318._4_4_;
        local_4e0 = local_530._0_8_;
        uStack_4d8 = local_530._8_8_;
        local_4f0 = 0x7f0000007f;
        uStack_4e8 = 0x7f0000007f;
        auVar45._8_8_ = local_530._8_8_;
        auVar45._0_8_ = local_530._0_8_;
        auVar44._8_8_ = 0x7f0000007f;
        auVar44._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar45,auVar44);
        local_530._0_8_ = auVar2._0_8_;
        local_4c0 = local_530._0_8_;
        local_530._8_8_ = auVar2._8_8_;
        uStack_4b8 = local_530._8_8_;
        local_4c4 = 0x17;
        local_530 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_530._0_8_;
        uStack_48 = local_530._8_8_;
        local_580 = local_530._0_8_;
        uStack_578 = local_530._8_8_;
        local_440._4_4_ = fStack_56c;
        local_440._0_4_ = local_570;
        local_440._8_4_ = fStack_568;
        local_440._12_4_ = fStack_564;
        local_450._0_4_ = local_530._0_4_;
        local_450._4_4_ = local_530._4_4_;
        uStack_448._0_4_ = local_530._8_4_;
        uStack_448._4_4_ = local_530._12_4_;
        local_570 = local_570 * (float)local_450;
        fStack_56c = fStack_56c * local_450._4_4_;
        fStack_568 = fStack_568 * (float)uStack_448;
        fStack_564 = fStack_564 * uStack_448._4_4_;
        local_930 = CONCAT44(fStack_56c,local_570);
        uStack_928 = CONCAT44(fStack_564,fStack_568);
        local_970 = local_570 + 1.0;
        fStack_96c = fStack_56c + 1.0;
        fStack_968 = fStack_568 + 1.0;
        fStack_964 = fStack_564 + 1.0;
        auVar39._4_4_ = fStack_96c;
        auVar39._0_4_ = local_970;
        auVar39._8_4_ = fStack_968;
        auVar39._12_4_ = fStack_964;
        _local_ac0 = vdivps_avx(local_960,auVar39);
        local_b00._0_4_ = (float)local_ac0._0_4_ * 2.0;
        local_b00._4_4_ = (float)local_ac0._4_4_ * 2.0;
        local_b00._8_4_ = fStack_ab8 * 2.0;
        local_b00._12_4_ = fStack_ab4 * 2.0;
        auVar34._8_8_ = 0x3f8000003f800000;
        auVar34._0_8_ = 0x3f8000003f800000;
        local_2870 = vsubps_avx(local_b00,auVar34);
        local_2538 = local_2810;
        local_2550 = local_2870._0_8_;
        uStack_2548 = local_2870._8_8_;
        *local_2810 = local_2870;
        local_2810 = local_2810 + 1;
        uStack_b8c = local_b90;
        uStack_b88 = local_b90;
        uStack_b84 = local_b90;
        uStack_b6c = local_b70;
        uStack_b68 = local_b70;
        uStack_b64 = local_b70;
        local_b10 = local_2590;
        uStack_b08 = uStack_2588;
        local_ad0 = local_25a0;
        uStack_ac8 = uStack_2598;
        local_ab0 = local_25a0;
        uStack_aa8 = uStack_2598;
        local_aa0 = local_2580;
        uStack_a98 = uStack_2578;
        uStack_a2c = local_a30;
        uStack_a28 = local_a30;
        uStack_a24 = local_a30;
        local_920 = local_960;
        local_450 = local_530._0_8_;
        uStack_448 = local_530._8_8_;
        local_360 = local_370;
        uStack_358 = uStack_368;
        local_320 = local_520;
        uStack_318 = uStack_518;
        local_300 = uVar7;
        uStack_2f8 = uVar8;
        local_210 = local_2b0;
        uStack_208 = uStack_2a8;
        local_1c0 = local_1f0;
      }
    }
  }
  else {
    for (local_2874 = 0; local_2874 < local_275c; local_2874 = local_2874 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd6d4,in_stack_ffffffffffffd6d0),
                         (int)((ulong)in_stack_ffffffffffffd6c8 >> 0x20));
      pauVar61 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_28c8);
      ncnn::Mat::~Mat((Mat *)0x519f31);
      local_2880 = pauVar61;
      for (local_28cc = 0; local_28cc + 7 < local_2760; local_28cc = local_28cc + 8) {
        local_2730 = local_2880;
        auVar58 = *(undefined1 (*) [24])*local_2880;
        uStack_26c8 = *(undefined8 *)(*local_2880 + 0x18);
        local_2900 = auVar58._0_8_;
        local_26e0 = local_2900;
        uStack_28f8 = auVar58._8_8_;
        uStack_26d8 = uStack_28f8;
        uStack_28f0 = auVar58._16_8_;
        uStack_26d0 = uStack_28f0;
        local_2524 = 0x3f800000;
        local_21c0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_21e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_21d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2700 = local_21e0._0_8_;
        uStack_26f8 = local_21e0._8_8_;
        uStack_26f0 = auStack_21d0._0_8_;
        uStack_26e8 = auStack_21d0._8_8_;
        local_2528 = 0x40000000;
        local_2180 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_21a0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_2190 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_2720 = local_21a0._0_8_;
        uStack_2718 = local_21a0._8_8_;
        uStack_2710 = auStack_2190._0_8_;
        uStack_2708 = auStack_2190._8_8_;
        uVar7 = local_2900;
        uVar8 = uStack_28f8;
        uVar9 = uStack_28f0;
        local_23c0._0_4_ = auVar58._0_4_;
        local_23c0._4_4_ = auVar58._4_4_;
        uStack_23b8._0_4_ = auVar58._8_4_;
        uStack_23b8._4_4_ = auVar58._12_4_;
        uStack_23b0._0_4_ = auVar58._16_4_;
        uStack_23b0._4_4_ = auVar58._20_4_;
        uStack_23a8._0_4_ = (float)uStack_26c8;
        uStack_23a8._4_4_ = (undefined4)((ulong)uStack_26c8 >> 0x20);
        uStack_22c4 = uStack_23a8._4_4_;
        local_23e0._0_4_ = local_21a0._0_4_;
        local_23e0._4_4_ = local_21a0._4_4_;
        uStack_23d8._0_4_ = local_21a0._8_4_;
        uStack_23d8._4_4_ = local_21a0._12_4_;
        uStack_23d0._0_4_ = auStack_2190._0_4_;
        uStack_23d0._4_4_ = auStack_2190._4_4_;
        uStack_23c8._0_4_ = auStack_2190._8_4_;
        local_22e0 = (float)local_23c0 * (float)local_23e0;
        fStack_22dc = local_23c0._4_4_ * local_23e0._4_4_;
        fStack_22d8 = (float)uStack_23b8 * (float)uStack_23d8;
        fStack_22d4 = uStack_23b8._4_4_ * uStack_23d8._4_4_;
        fStack_22d0 = (float)uStack_23b0 * (float)uStack_23d0;
        fStack_22cc = uStack_23b0._4_4_ * uStack_23d0._4_4_;
        fStack_22c8 = (float)uStack_23a8 * (float)uStack_23c8;
        local_22a4 = 0x3f800000;
        local_2240 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2260 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2250 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2300 = local_2260._0_8_;
        uStack_22f8 = local_2260._8_8_;
        uStack_22f0 = auStack_2250._0_8_;
        uStack_22e8 = auStack_2250._8_8_;
        local_20c0._16_8_ = auStack_2250._0_8_;
        local_20c0._0_16_ = local_2260;
        local_20c0._24_8_ = auStack_2250._8_8_;
        local_1280 = ZEXT832(0) << 0x20;
        local_2280 = 0;
        local_1260._8_8_ = SUB328(ZEXT832(0),4);
        uStack_2278 = local_1260._8_8_;
        uStack_2270 = 0;
        uStack_2268 = 0;
        local_22a0 = CONCAT44(fStack_22dc,local_22e0);
        uStack_2298 = CONCAT44(fStack_22d4,fStack_22d8);
        uStack_2290 = CONCAT44(fStack_22cc,fStack_22d0);
        uStack_2288 = CONCAT44(uStack_23a8._4_4_,fStack_22c8);
        auVar4._8_8_ = uStack_2298;
        auVar4._0_8_ = local_22a0;
        auVar4._16_8_ = uStack_2290;
        auVar4._24_8_ = uStack_2288;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_1260._8_8_) << 0x40,auVar4);
        local_1f60 = 0x3f8000003f800000;
        uStack_1f58 = 0x3f8000003f800000;
        uStack_1f50 = 0x3f8000003f800000;
        uStack_1f48 = 0x3f8000003f800000;
        local_1ee0._0_8_ = auVar6._0_8_;
        local_11c0 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_11b8 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_11b0 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_11a8 = local_1ee0._24_8_;
        local_11e0 = 0x42b0c0a542b0c0a5;
        uStack_11d8 = 0x42b0c0a542b0c0a5;
        uStack_11d0 = 0x42b0c0a542b0c0a5;
        uStack_11c8 = 0x42b0c0a542b0c0a5;
        auVar24._8_8_ = 0x42b0c0a542b0c0a5;
        auVar24._0_8_ = 0x42b0c0a542b0c0a5;
        auVar24._16_8_ = 0x42b0c0a542b0c0a5;
        auVar24._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar24);
        local_1ee0._0_8_ = auVar6._0_8_;
        local_1140 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_1138 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_1130 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_1128 = local_1ee0._24_8_;
        local_1160 = 0xc2b0c0a5c2b0c0a5;
        uStack_1158 = 0xc2b0c0a5c2b0c0a5;
        uStack_1150 = 0xc2b0c0a5c2b0c0a5;
        uStack_1148 = 0xc2b0c0a5c2b0c0a5;
        auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar26);
        local_1ee0._0_8_ = auVar4._0_8_;
        uVar10 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar4._8_8_;
        uVar11 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar4._16_8_;
        uVar12 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar4._24_8_;
        uVar13 = local_1ee0._24_8_;
        local_1b80 = 0x3fb8aa3b3fb8aa3b;
        uStack_1b78 = 0x3fb8aa3b3fb8aa3b;
        uStack_1b70 = 0x3fb8aa3b3fb8aa3b;
        uStack_1b68 = 0x3fb8aa3b3fb8aa3b;
        local_1b60._0_4_ = auVar4._0_4_;
        local_1b60._4_4_ = auVar4._4_4_;
        uStack_1b58._0_4_ = auVar4._8_4_;
        uStack_1b58._4_4_ = auVar4._12_4_;
        uStack_1b50._0_4_ = auVar4._16_4_;
        uStack_1b50._4_4_ = auVar4._20_4_;
        uStack_1b48._0_4_ = auVar4._24_4_;
        uStack_1b48._4_4_ = auVar4._28_4_;
        local_1f20._4_4_ = local_1b60._4_4_ * 1.442695;
        local_1f20._0_4_ = (float)local_1b60 * 1.442695;
        uStack_1f18._0_4_ = (float)uStack_1b58 * 1.442695;
        uStack_1f18._4_4_ = uStack_1b58._4_4_ * 1.442695;
        uStack_1f10._0_4_ = (float)uStack_1b50 * 1.442695;
        uStack_1f10._4_4_ = uStack_1b50._4_4_ * 1.442695;
        auVar58 = _local_1f20;
        uStack_1f08._0_4_ = (float)uStack_1b48 * 1.442695;
        uStack_1f08._4_4_ = uStack_1b48._4_4_;
        auVar6 = _local_1f20;
        local_1960 = local_1f20;
        uStack_1958 = uStack_1f18;
        uStack_1f10 = auVar58._16_8_;
        uStack_1950 = uStack_1f10;
        uStack_1f08 = auVar6._24_8_;
        uStack_1948 = uStack_1f08;
        local_1ac0 = 0x3f0000003f000000;
        uStack_1ab8 = 0x3f0000003f000000;
        uStack_1ab0 = 0x3f0000003f000000;
        uStack_1aa8 = 0x3f0000003f000000;
        local_1f20._4_4_ = local_1b60._4_4_ * 1.442695 + 0.5;
        local_1f20._0_4_ = (float)local_1b60 * 1.442695 + 0.5;
        uStack_1f18._0_4_ = (float)uStack_1b58 * 1.442695 + 0.5;
        uStack_1f18._4_4_ = uStack_1b58._4_4_ * 1.442695 + 0.5;
        uStack_1f10._0_4_ = (float)uStack_1b50 * 1.442695 + 0.5;
        uStack_1f10._4_4_ = uStack_1b50._4_4_ * 1.442695 + 0.5;
        uStack_1f08._0_4_ = (float)uStack_1b48 * 1.442695 + 0.5;
        uStack_1f08._4_4_ = uStack_1b48._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1f20,1);
        auVar6 = vcmpps_avx(_local_1f20,auVar5,1);
        local_1f80._0_8_ = auVar6._0_8_;
        local_10c0 = local_1f80._0_8_;
        local_1f80._8_8_ = auVar6._8_8_;
        uStack_10b8 = local_1f80._8_8_;
        local_1f80._16_8_ = auVar6._16_8_;
        uStack_10b0 = local_1f80._16_8_;
        local_1f80._24_8_ = auVar6._24_8_;
        uStack_10a8 = local_1f80._24_8_;
        local_10e0 = 0x3f8000003f800000;
        uStack_10d8 = 0x3f8000003f800000;
        uStack_10d0 = 0x3f8000003f800000;
        uStack_10c8 = 0x3f8000003f800000;
        auVar28._8_8_ = 0x3f8000003f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._16_8_ = 0x3f8000003f800000;
        auVar28._24_8_ = 0x3f8000003f800000;
        local_1f80 = vandps_avx(auVar6,auVar28);
        local_1f00 = auVar5._0_8_;
        local_1e20 = local_1f00;
        uStack_1ef8 = auVar5._8_8_;
        uStack_1e18 = uStack_1ef8;
        uStack_1ef0 = auVar5._16_8_;
        uStack_1e10 = uStack_1ef0;
        uStack_1ee8 = auVar5._24_8_;
        uStack_1e08 = uStack_1ee8;
        local_1e40 = local_1f80._0_8_;
        uStack_1e38 = local_1f80._8_8_;
        uStack_1e30 = local_1f80._16_8_;
        uStack_1e28 = local_1f80._24_8_;
        _local_1f20 = vsubps_avx(auVar5,local_1f80);
        local_1bc0 = 0x3f3180003f318000;
        uStack_1bb8 = 0x3f3180003f318000;
        uStack_1bb0 = 0x3f3180003f318000;
        uStack_1ba8 = 0x3f3180003f318000;
        local_1ba0._0_4_ = local_1f20._0_4_;
        local_1ba0._4_4_ = local_1f20._4_4_;
        uStack_1b98._0_4_ = local_1f20._8_4_;
        uStack_1b98._4_4_ = local_1f20._12_4_;
        uStack_1b90._0_4_ = local_1f20._16_4_;
        uStack_1b90._4_4_ = local_1f20._20_4_;
        uStack_1b88._0_4_ = local_1f20._24_4_;
        uStack_1b88._4_4_ = local_1f20._28_4_;
        local_1f00._4_4_ = local_1ba0._4_4_ * 0.6933594;
        local_1f00._0_4_ = (float)local_1ba0 * 0.6933594;
        uStack_1ef8._0_4_ = (float)uStack_1b98 * 0.6933594;
        uStack_1ef8._4_4_ = uStack_1b98._4_4_ * 0.6933594;
        uStack_1ef0._0_4_ = (float)uStack_1b90 * 0.6933594;
        uStack_1ef0._4_4_ = uStack_1b90._4_4_ * 0.6933594;
        auVar58 = _local_1f00;
        uStack_1ee8._0_4_ = (float)uStack_1b88 * 0.6933594;
        uStack_1ee8._4_4_ = uStack_1b88._4_4_;
        auVar24 = _local_1f00;
        local_1be0 = local_1f20;
        uStack_1bd8 = uStack_1f18;
        uStack_1bd0 = uStack_1f10;
        uStack_1bc8 = uStack_1f08;
        local_1c00 = 0xb95e8083b95e8083;
        uStack_1bf8 = 0xb95e8083b95e8083;
        uStack_1bf0 = 0xb95e8083b95e8083;
        uStack_1be8 = 0xb95e8083b95e8083;
        local_1e60 = local_1ee0._0_8_;
        uStack_1e58 = local_1ee0._8_8_;
        uStack_1e50 = local_1ee0._16_8_;
        uStack_1e48 = local_1ee0._24_8_;
        local_1e80 = local_1f00;
        uStack_1e78 = uStack_1ef8;
        uStack_1ef0 = auVar58._16_8_;
        uStack_1e70 = uStack_1ef0;
        uStack_1ee8 = auVar24._24_8_;
        uStack_1e68 = uStack_1ee8;
        auVar20._16_8_ = uStack_1ef0;
        auVar20._0_16_ = _local_1f00;
        auVar20._24_8_ = uStack_1ee8;
        auVar6 = vsubps_avx(auVar4,auVar20);
        local_1ee0._0_8_ = auVar6._0_8_;
        local_1ea0 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_1e98 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_1e90 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_1e88 = local_1ee0._24_8_;
        local_1ec0 = CONCAT44(local_1ba0._4_4_ * -0.00021219444,(float)local_1ba0 * -0.00021219444);
        uStack_1eb8 = CONCAT44(uStack_1b98._4_4_ * -0.00021219444,
                               (float)uStack_1b98 * -0.00021219444);
        uStack_1eb0 = CONCAT44(uStack_1b90._4_4_ * -0.00021219444,
                               (float)uStack_1b90 * -0.00021219444);
        uStack_1ea8 = CONCAT44(uStack_1b88._4_4_,(float)uStack_1b88 * -0.00021219444);
        auVar19._8_8_ = uStack_1eb8;
        auVar19._0_8_ = local_1ec0;
        auVar19._16_8_ = uStack_1eb0;
        auVar19._24_8_ = uStack_1ea8;
        local_1ee0 = vsubps_avx(auVar6,auVar19);
        local_1c40 = local_1ee0._0_8_;
        uStack_1c38 = local_1ee0._8_8_;
        uStack_1c30 = local_1ee0._16_8_;
        uStack_1c28 = local_1ee0._24_8_;
        local_1c20._0_4_ = local_1ee0._0_4_;
        local_1c20._4_4_ = local_1ee0._4_4_;
        uStack_1c18._0_4_ = local_1ee0._8_4_;
        uStack_1c18._4_4_ = local_1ee0._12_4_;
        uStack_1c10._0_4_ = local_1ee0._16_4_;
        uStack_1c10._4_4_ = local_1ee0._20_4_;
        uStack_1c08._0_4_ = local_1ee0._24_4_;
        uStack_1c08._4_4_ = local_1ee0._28_4_;
        fStack_1f84 = uStack_1c08._4_4_;
        local_1fa0 = (float)local_1c20 * (float)local_1c20;
        fStack_1f9c = local_1c20._4_4_ * local_1c20._4_4_;
        fStack_1f98 = (float)uStack_1c18 * (float)uStack_1c18;
        fStack_1f94 = uStack_1c18._4_4_ * uStack_1c18._4_4_;
        fStack_1f90 = (float)uStack_1c10 * (float)uStack_1c10;
        fStack_1f8c = uStack_1c10._4_4_ * uStack_1c10._4_4_;
        fStack_1f88 = (float)uStack_1c08 * (float)uStack_1c08;
        local_1c60 = 0x3950696739506967;
        uStack_1c58 = 0x3950696739506967;
        uStack_1c50 = 0x3950696739506967;
        uStack_1c48 = 0x3950696739506967;
        local_1c80 = local_1ee0._0_8_;
        uStack_1c78 = local_1ee0._8_8_;
        uStack_1c70 = local_1ee0._16_8_;
        uStack_1c68 = local_1ee0._24_8_;
        local_19a0 = CONCAT44(local_1c20._4_4_ * 0.00019875691,(float)local_1c20 * 0.00019875691);
        uStack_1998 = CONCAT44(uStack_1c18._4_4_ * 0.00019875691,(float)uStack_1c18 * 0.00019875691)
        ;
        uStack_1990 = CONCAT44(uStack_1c10._4_4_ * 0.00019875691,(float)uStack_1c10 * 0.00019875691)
        ;
        uStack_1988 = CONCAT44(0x39506967,(float)uStack_1c08 * 0.00019875691);
        local_19c0 = 0x3ab743ce3ab743ce;
        uStack_19b8 = 0x3ab743ce3ab743ce;
        uStack_19b0 = 0x3ab743ce3ab743ce;
        uStack_19a8 = 0x3ab743ce3ab743ce;
        local_1fc0 = (float)local_1c20 * 0.00019875691 + 0.0013981999;
        fStack_1fbc = local_1c20._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fb8 = (float)uStack_1c18 * 0.00019875691 + 0.0013981999;
        fStack_1fb4 = uStack_1c18._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fb0 = (float)uStack_1c10 * 0.00019875691 + 0.0013981999;
        fStack_1fac = uStack_1c10._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fa8 = (float)uStack_1c08 * 0.00019875691 + 0.0013981999;
        local_1ca0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1c98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1c90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1c88 = CONCAT44(0x3ad150fb,fStack_1fa8);
        local_1cc0 = local_1ee0._0_8_;
        uStack_1cb8 = local_1ee0._8_8_;
        uStack_1cb0 = local_1ee0._16_8_;
        uStack_1ca8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1c20;
        fStack_1fbc = fStack_1fbc * local_1c20._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1c18;
        fStack_1fb4 = fStack_1fb4 * uStack_1c18._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1c10;
        fStack_1fac = fStack_1fac * uStack_1c10._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1c08;
        local_19e0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_19d8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_19d0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_19c8 = CONCAT44(0x3ad150fb,fStack_1fa8);
        local_1a00 = 0x3c0889083c088908;
        uStack_19f8 = 0x3c0889083c088908;
        uStack_19f0 = 0x3c0889083c088908;
        uStack_19e8 = 0x3c0889083c088908;
        local_1fc0 = local_1fc0 + 0.008333452;
        fStack_1fbc = fStack_1fbc + 0.008333452;
        fStack_1fb8 = fStack_1fb8 + 0.008333452;
        fStack_1fb4 = fStack_1fb4 + 0.008333452;
        fStack_1fb0 = fStack_1fb0 + 0.008333452;
        fStack_1fac = fStack_1fac + 0.008333452;
        fStack_1fa8 = fStack_1fa8 + 0.008333452;
        local_1ce0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1cd8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1cd0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1cc8 = CONCAT44(0x3c22b327,fStack_1fa8);
        local_1d00 = local_1ee0._0_8_;
        uStack_1cf8 = local_1ee0._8_8_;
        uStack_1cf0 = local_1ee0._16_8_;
        uStack_1ce8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1c20;
        fStack_1fbc = fStack_1fbc * local_1c20._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1c18;
        fStack_1fb4 = fStack_1fb4 * uStack_1c18._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1c10;
        fStack_1fac = fStack_1fac * uStack_1c10._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1c08;
        local_1a20 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1a18 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1a10 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1a08 = CONCAT44(0x3c22b327,fStack_1fa8);
        local_1a40 = 0x3d2aa9c13d2aa9c1;
        uStack_1a38 = 0x3d2aa9c13d2aa9c1;
        uStack_1a30 = 0x3d2aa9c13d2aa9c1;
        uStack_1a28 = 0x3d2aa9c13d2aa9c1;
        local_1fc0 = local_1fc0 + 0.041665796;
        fStack_1fbc = fStack_1fbc + 0.041665796;
        fStack_1fb8 = fStack_1fb8 + 0.041665796;
        fStack_1fb4 = fStack_1fb4 + 0.041665796;
        fStack_1fb0 = fStack_1fb0 + 0.041665796;
        fStack_1fac = fStack_1fac + 0.041665796;
        fStack_1fa8 = fStack_1fa8 + 0.041665796;
        local_1d20 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1d18 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1d10 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1d08 = CONCAT44(0x3d53568b,fStack_1fa8);
        local_1d40 = local_1ee0._0_8_;
        uStack_1d38 = local_1ee0._8_8_;
        uStack_1d30 = local_1ee0._16_8_;
        uStack_1d28 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1c20;
        fStack_1fbc = fStack_1fbc * local_1c20._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1c18;
        fStack_1fb4 = fStack_1fb4 * uStack_1c18._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1c10;
        fStack_1fac = fStack_1fac * uStack_1c10._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1c08;
        local_1a60 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1a58 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1a50 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1a48 = CONCAT44(0x3d53568b,fStack_1fa8);
        local_1a80 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a78 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a70 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a68 = 0x3e2aaaaa3e2aaaaa;
        local_1fc0 = local_1fc0 + 0.16666666;
        fStack_1fbc = fStack_1fbc + 0.16666666;
        fStack_1fb8 = fStack_1fb8 + 0.16666666;
        fStack_1fb4 = fStack_1fb4 + 0.16666666;
        fStack_1fb0 = fStack_1fb0 + 0.16666666;
        fStack_1fac = fStack_1fac + 0.16666666;
        fStack_1fa8 = fStack_1fa8 + 0.16666666;
        local_1d60 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1d58 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1d50 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1d48 = CONCAT44(0x3e5f804d,fStack_1fa8);
        local_1d80 = local_1ee0._0_8_;
        uStack_1d78 = local_1ee0._8_8_;
        uStack_1d70 = local_1ee0._16_8_;
        uStack_1d68 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1c20;
        fStack_1fbc = fStack_1fbc * local_1c20._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1c18;
        fStack_1fb4 = fStack_1fb4 * uStack_1c18._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1c10;
        fStack_1fac = fStack_1fac * uStack_1c10._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1c08;
        local_1aa0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1a98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1a90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1a88 = CONCAT44(0x3e5f804d,fStack_1fa8);
        local_1fc0 = local_1fc0 + 0.5;
        fStack_1fbc = fStack_1fbc + 0.5;
        fStack_1fb8 = fStack_1fb8 + 0.5;
        fStack_1fb4 = fStack_1fb4 + 0.5;
        fStack_1fb0 = fStack_1fb0 + 0.5;
        fStack_1fac = fStack_1fac + 0.5;
        fStack_1fa8 = fStack_1fa8 + 0.5;
        local_1da0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1d98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1d90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1d88 = CONCAT44(0x3f37e013,fStack_1fa8);
        local_1dc0 = CONCAT44(fStack_1f9c,local_1fa0);
        uStack_1db8 = CONCAT44(fStack_1f94,fStack_1f98);
        uStack_1db0 = CONCAT44(fStack_1f8c,fStack_1f90);
        uStack_1da8 = CONCAT44(uStack_1c08._4_4_,fStack_1f88);
        local_1fc0 = local_1fc0 * local_1fa0;
        fStack_1fbc = fStack_1fbc * fStack_1f9c;
        fStack_1fb8 = fStack_1fb8 * fStack_1f98;
        fStack_1fb4 = fStack_1fb4 * fStack_1f94;
        fStack_1fb0 = fStack_1fb0 * fStack_1f90;
        fStack_1fac = fStack_1fac * fStack_1f8c;
        fStack_1fa8 = fStack_1fa8 * fStack_1f88;
        local_1ae0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1ad8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1ad0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1ac8 = CONCAT44(0x3f37e013,fStack_1fa8);
        local_1b00 = local_1ee0._0_8_;
        uStack_1af8 = local_1ee0._8_8_;
        uStack_1af0 = local_1ee0._16_8_;
        uStack_1ae8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 + (float)local_1c20;
        fStack_1fbc = fStack_1fbc + local_1c20._4_4_;
        fStack_1fb8 = fStack_1fb8 + (float)uStack_1c18;
        fStack_1fb4 = fStack_1fb4 + uStack_1c18._4_4_;
        fStack_1fb0 = fStack_1fb0 + (float)uStack_1c10;
        fStack_1fac = fStack_1fac + uStack_1c10._4_4_;
        fStack_1fa8 = fStack_1fa8 + (float)uStack_1c08;
        local_1b20 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1b18 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1b10 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1b08 = CONCAT44(uStack_1c08._4_4_ + 0.71826285,fStack_1fa8);
        local_1b40 = 0x3f8000003f800000;
        uStack_1b38 = 0x3f8000003f800000;
        uStack_1b30 = 0x3f8000003f800000;
        uStack_1b28 = 0x3f8000003f800000;
        local_1fc0 = local_1fc0 + 1.0;
        fStack_1fbc = fStack_1fbc + 1.0;
        fStack_1fb8 = fStack_1fb8 + 1.0;
        fStack_1fb4 = fStack_1fb4 + 1.0;
        fStack_1fb0 = fStack_1fb0 + 1.0;
        fStack_1fac = fStack_1fac + 1.0;
        fStack_1fa8 = fStack_1fa8 + 1.0;
        fStack_1fa4 = uStack_1c08._4_4_ + 0.71826285 + 1.0;
        local_1080 = local_1f20;
        uStack_1078 = uStack_1f18;
        uStack_1070 = uStack_1f10;
        uStack_1068 = uStack_1f08;
        local_1f40 = CONCAT44((int)local_1ba0._4_4_,(int)(float)local_1ba0);
        uStack_1f38 = CONCAT44((int)uStack_1b98._4_4_,(int)(float)uStack_1b98);
        uStack_1f30 = CONCAT44((int)uStack_1b90._4_4_,(int)(float)uStack_1b90);
        uStack_1f28 = CONCAT44((int)uStack_1b88._4_4_,(int)(float)uStack_1b88);
        local_e80 = local_1f40;
        uStack_e78 = uStack_1f38;
        uStack_e70 = uStack_1f30;
        uStack_e68 = uStack_1f28;
        local_ea0 = 0x7f0000007f;
        uStack_e98 = 0x7f0000007f;
        uStack_e90 = 0x7f0000007f;
        uStack_e88 = 0x7f0000007f;
        local_f20 = local_1f40;
        uStack_f18 = uStack_1f38;
        uStack_f10 = uStack_1f30;
        uStack_f08 = uStack_1f28;
        local_f40 = 0x7f0000007f;
        uStack_f38 = 0x7f0000007f;
        uStack_f30 = 0x7f0000007f;
        uStack_f28 = 0x7f0000007f;
        local_ed0 = 0x7f0000007f;
        uStack_ec8 = 0x7f0000007f;
        local_ee0 = 0x7f0000007f;
        uStack_ed8 = 0x7f0000007f;
        local_c60 = local_1f40;
        uStack_c58 = uStack_1f38;
        local_c70 = 0x7f0000007f;
        uStack_c68 = 0x7f0000007f;
        auVar29._8_8_ = uStack_1f38;
        auVar29._0_8_ = local_1f40;
        auVar3._8_8_ = 0x7f0000007f;
        auVar3._0_8_ = 0x7f0000007f;
        local_eb0 = vpaddd_avx(auVar29,auVar3);
        local_c80 = uStack_1f30;
        uStack_c78 = uStack_1f28;
        local_c90 = 0x7f0000007f;
        uStack_c88 = 0x7f0000007f;
        auVar1._8_8_ = uStack_1f28;
        auVar1._0_8_ = uStack_1f30;
        auVar2._8_8_ = 0x7f0000007f;
        auVar2._0_8_ = 0x7f0000007f;
        local_ec0 = vpaddd_avx(auVar1,auVar2);
        local_f60 = local_eb0._0_8_;
        uStack_f58 = local_eb0._8_8_;
        uStack_f50 = local_ec0._0_8_;
        uStack_f48 = local_ec0._8_8_;
        local_f00 = local_eb0._0_8_;
        uStack_ef8 = local_eb0._8_8_;
        uStack_ef0 = local_ec0._0_8_;
        uStack_ee8 = local_ec0._8_8_;
        local_d00 = local_eb0._0_8_;
        uStack_cf8 = local_eb0._8_8_;
        uStack_cf0 = local_ec0._0_8_;
        uStack_ce8 = local_ec0._8_8_;
        local_d04 = 0x17;
        local_d80 = local_eb0._0_8_;
        uStack_d78 = local_eb0._8_8_;
        uStack_d70 = local_ec0._0_8_;
        uStack_d68 = local_ec0._8_8_;
        local_be0 = local_eb0._0_8_;
        uStack_bd8 = local_eb0._8_8_;
        local_be4 = 0x17;
        local_d20 = vpslld_avx(local_eb0,ZEXT416(0x17));
        local_c00 = local_ec0._0_8_;
        uStack_bf8 = local_ec0._8_8_;
        local_c04 = 0x17;
        local_d30 = vpslld_avx(local_ec0,ZEXT416(0x17));
        local_da0 = local_d20._0_8_;
        uStack_d98 = local_d20._8_8_;
        uStack_d90 = local_d30._0_8_;
        uStack_d88 = local_d30._8_8_;
        local_d60 = local_d20._0_8_;
        uStack_d58 = local_d20._8_8_;
        uStack_d50 = local_d30._0_8_;
        uStack_d48 = local_d30._8_8_;
        local_1f40 = local_d20._0_8_;
        uStack_1f38 = local_d20._8_8_;
        uStack_1f30 = local_d30._0_8_;
        uStack_1f28 = local_d30._8_8_;
        local_cc0 = local_d20._0_8_;
        uStack_cb8 = local_d20._8_8_;
        uStack_cb0 = local_d30._0_8_;
        uStack_ca8 = local_d30._8_8_;
        local_1fe0 = local_d20._0_8_;
        uStack_1fd8 = local_d20._8_8_;
        uStack_1fd0 = local_d30._0_8_;
        uStack_1fc8 = local_d30._8_8_;
        local_1de0._4_4_ = fStack_1fbc;
        local_1de0._0_4_ = local_1fc0;
        local_1de0._8_4_ = fStack_1fb8;
        local_1de0._12_4_ = fStack_1fb4;
        local_1de0._16_4_ = fStack_1fb0;
        local_1de0._20_4_ = fStack_1fac;
        local_1de0._24_4_ = fStack_1fa8;
        local_1de0._28_4_ = fStack_1fa4;
        local_1e00._0_4_ = local_d20._0_4_;
        local_1e00._4_4_ = local_d20._4_4_;
        uStack_1df8._0_4_ = local_d20._8_4_;
        uStack_1df8._4_4_ = local_d20._12_4_;
        uStack_1df0._0_4_ = local_d30._0_4_;
        uStack_1df0._4_4_ = local_d30._4_4_;
        uStack_1de8._0_4_ = local_d30._8_4_;
        local_1fc0 = local_1fc0 * (float)local_1e00;
        fStack_1fbc = fStack_1fbc * local_1e00._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1df8;
        fStack_1fb4 = fStack_1fb4 * uStack_1df8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1df0;
        fStack_1fac = fStack_1fac * uStack_1df0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1de8;
        local_2060 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_2058 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_2050 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_2048 = CONCAT44(fStack_1fa4,fStack_1fa8);
        local_2040._0_4_ = local_2260._0_4_;
        local_2040._4_4_ = local_2260._4_4_;
        fStack_2038 = local_2260._8_4_;
        fStack_2034 = local_2260._12_4_;
        fStack_2030 = auStack_2250._0_4_;
        fStack_202c = auStack_2250._4_4_;
        fStack_2028 = auStack_2250._8_4_;
        fStack_2024 = auStack_2250._12_4_;
        local_20e0 = (float)local_2040._0_4_ + local_1fc0;
        fStack_20dc = (float)local_2040._4_4_ + fStack_1fbc;
        fStack_20d8 = fStack_2038 + fStack_1fb8;
        fStack_20d4 = fStack_2034 + fStack_1fb4;
        fStack_20d0 = fStack_2030 + fStack_1fb0;
        fStack_20cc = fStack_202c + fStack_1fac;
        fStack_20c8 = fStack_2028 + fStack_1fa8;
        fStack_20c4 = fStack_2024 + fStack_1fa4;
        auVar5._4_4_ = fStack_20dc;
        auVar5._0_4_ = local_20e0;
        auVar5._8_4_ = fStack_20d8;
        auVar5._12_4_ = fStack_20d4;
        auVar5._16_4_ = fStack_20d0;
        auVar5._20_4_ = fStack_20cc;
        auVar5._24_4_ = fStack_20c8;
        auVar5._28_4_ = fStack_20c4;
        _local_2400 = vdivps_avx(local_20c0,auVar5);
        local_2420 = local_21a0._0_8_;
        uStack_2418 = local_21a0._8_8_;
        uStack_2410 = auStack_2190._0_8_;
        uStack_2408 = auStack_2190._8_8_;
        local_24c0._4_4_ = (float)local_2400._4_4_ * local_23e0._4_4_;
        local_24c0._0_4_ = (float)local_2400._0_4_ * (float)local_23e0;
        local_24c0._8_4_ = fStack_23f8 * (float)uStack_23d8;
        local_24c0._12_4_ = fStack_23f4 * uStack_23d8._4_4_;
        local_24c0._16_4_ = fStack_23f0 * (float)uStack_23d0;
        local_24c0._20_4_ = fStack_23ec * uStack_23d0._4_4_;
        local_24c0._24_4_ = fStack_23e8 * (float)uStack_23c8;
        local_24c0._28_4_ = local_2400._28_4_;
        local_24e0 = local_21e0._0_8_;
        uStack_24d8 = local_21e0._8_8_;
        uStack_24d0 = auStack_21d0._0_8_;
        uStack_24c8 = auStack_21d0._8_8_;
        auVar6._16_8_ = auStack_21d0._0_8_;
        auVar6._0_16_ = local_21e0;
        auVar6._24_8_ = auStack_21d0._8_8_;
        auVar6 = vsubps_avx(local_24c0,auVar6);
        local_2628 = local_2880;
        local_2900 = auVar6._0_8_;
        local_2660 = local_2900;
        uStack_28f8 = auVar6._8_8_;
        uStack_2658 = uStack_28f8;
        uStack_28f0 = auVar6._16_8_;
        uStack_2650 = uStack_28f0;
        uStack_28e8 = auVar6._24_8_;
        uStack_2648 = uStack_28e8;
        *local_2880 = auVar6;
        local_2880 = local_2880 + 1;
        local_23e0 = local_21a0._0_8_;
        uStack_23d8 = local_21a0._8_8_;
        uStack_23d0 = auStack_2190._0_8_;
        uStack_23c8 = auStack_2190._8_8_;
        local_23c0 = uVar7;
        uStack_23b8 = uVar8;
        uStack_23b0 = uVar9;
        uStack_23a8 = uStack_26c8;
        local_223c = local_2240;
        local_2238 = local_2240;
        local_2234 = local_2240;
        local_2230 = local_2240;
        local_222c = local_2240;
        local_2228 = local_2240;
        local_2224 = local_2240;
        local_21bc = local_21c0;
        local_21b8 = local_21c0;
        local_21b4 = local_21c0;
        local_21b0 = local_21c0;
        local_21ac = local_21c0;
        local_21a8 = local_21c0;
        local_21a4 = local_21c0;
        local_217c = local_2180;
        local_2178 = local_2180;
        local_2174 = local_2180;
        local_2170 = local_2180;
        local_216c = local_2180;
        local_2168 = local_2180;
        local_2164 = local_2180;
        _local_2040 = local_20c0;
        _local_1f00 = auVar24;
        local_1e00 = local_d20._0_8_;
        uStack_1df8 = local_d20._8_8_;
        uStack_1df0 = local_d30._0_8_;
        uStack_1de8 = local_d30._8_8_;
        local_1c20 = local_1c40;
        uStack_1c18 = uStack_1c38;
        uStack_1c10 = uStack_1c30;
        uStack_1c08 = uStack_1c28;
        local_1ba0 = local_1f20;
        uStack_1b98 = uStack_1f18;
        uStack_1b90 = uStack_1f10;
        uStack_1b88 = uStack_1f08;
        local_1b60 = uVar10;
        uStack_1b58 = uVar11;
        uStack_1b50 = uVar12;
        uStack_1b48 = uVar13;
        local_1980 = local_1ac0;
        uStack_1978 = uStack_1ab8;
        uStack_1970 = uStack_1ab0;
        uStack_1968 = uStack_1aa8;
        local_1260 = local_1280;
      }
      for (; local_28cc + 3 < local_2760; local_28cc = local_28cc + 4) {
        local_25e0 = local_2880;
        local_25b0 = *(undefined8 *)*local_2880;
        uStack_25a8 = *(undefined8 *)(*local_2880 + 8);
        local_b14 = 0x3f800000;
        local_b30 = 0x3f800000;
        local_25c0 = 0x3f8000003f800000;
        uStack_25b8 = 0x3f8000003f800000;
        local_b34 = 0x40000000;
        local_b50 = 0x40000000;
        local_25d0 = 0x4000000040000000;
        uStack_25c8 = 0x4000000040000000;
        local_a60._0_4_ = (float)local_25b0;
        local_a60._4_4_ = (float)((ulong)local_25b0 >> 0x20);
        uStack_a58._0_4_ = (float)uStack_25a8;
        uStack_a58._4_4_ = (float)((ulong)uStack_25a8 >> 0x20);
        local_9e0 = (float)local_a60 * 2.0;
        fStack_9dc = local_a60._4_4_ * 2.0;
        fStack_9d8 = (float)uStack_a58 * 2.0;
        fStack_9d4 = uStack_a58._4_4_ * 2.0;
        local_9b4 = 0x3f800000;
        local_9d0 = 0x3f800000;
        local_9f0 = 0x3f8000003f800000;
        uStack_9e8 = 0x3f8000003f800000;
        local_980._8_8_ = 0x3f8000003f800000;
        local_980._0_8_ = 0x3f8000003f800000;
        local_1e0 = ZEXT816(0) << 0x20;
        local_9a0 = 0;
        local_1d0._8_8_ = SUB168(ZEXT816(0),4);
        uStack_998 = local_1d0._8_8_;
        local_9b0 = CONCAT44(fStack_9dc,local_9e0);
        uStack_9a8 = CONCAT44(fStack_9d4,fStack_9d8);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_1d0._8_8_;
        auVar37._8_8_ = uStack_9a8;
        auVar37._0_8_ = local_9b0;
        auVar2 = vsubps_avx(auVar60 << 0x40,auVar37);
        local_8d0 = 0x3f8000003f800000;
        uStack_8c8 = 0x3f8000003f800000;
        local_890._0_8_ = auVar2._0_8_;
        local_180 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_178 = local_890._8_8_;
        local_190 = 0x42b0c0a542b0c0a5;
        uStack_188 = 0x42b0c0a542b0c0a5;
        auVar49._8_8_ = 0x42b0c0a542b0c0a5;
        auVar49._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar49);
        local_890._0_8_ = auVar2._0_8_;
        local_140 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_138 = local_890._8_8_;
        local_150 = 0xc2b0c0a5c2b0c0a5;
        uStack_148 = 0xc2b0c0a5c2b0c0a5;
        auVar51._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar51);
        local_890._0_8_ = auVar3._0_8_;
        uVar7 = local_890._0_8_;
        local_890._8_8_ = auVar3._8_8_;
        uVar8 = local_890._8_8_;
        local_6a0 = 0x3fb8aa3b3fb8aa3b;
        uStack_698 = 0x3fb8aa3b3fb8aa3b;
        local_690._0_4_ = auVar3._0_4_;
        local_690._4_4_ = auVar3._4_4_;
        uStack_688._0_4_ = auVar3._8_4_;
        uStack_688._4_4_ = auVar3._12_4_;
        local_8b0._4_4_ = local_690._4_4_ * 1.442695;
        local_8b0._0_4_ = (float)local_690 * 1.442695;
        uStack_8a8._0_4_ = (float)uStack_688 * 1.442695;
        uStack_8a8._4_4_ = uStack_688._4_4_ * 1.442695;
        local_590 = local_8b0;
        uStack_588 = uStack_8a8;
        local_640 = 0x3f0000003f000000;
        uStack_638 = 0x3f0000003f000000;
        local_8b0._0_4_ = (float)local_690 * 1.442695 + 0.5;
        local_8b0._4_4_ = local_690._4_4_ * 1.442695 + 0.5;
        fVar63 = (float)uStack_688 * 1.442695 + 0.5;
        fVar64 = uStack_688._4_4_ * 1.442695 + 0.5;
        uStack_8a8._0_4_ = fVar63;
        uStack_8a8._4_4_ = fVar64;
        local_100 = local_8b0;
        uStack_f8 = uStack_8a8;
        local_8c0._4_4_ = (int)(float)local_8b0._4_4_;
        local_8c0._0_4_ = (int)(float)local_8b0._0_4_;
        local_8c0._8_4_ = (int)fVar63;
        local_8c0._12_4_ = (int)fVar64;
        local_e0 = local_8c0._0_8_;
        uStack_d8 = local_8c0._8_8_;
        auVar53._8_8_ = local_8c0._8_8_;
        auVar53._0_8_ = local_8c0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar53);
        local_8a0 = auVar1._0_8_;
        local_a0 = local_8a0;
        uStack_898 = auVar1._8_8_;
        uStack_98 = uStack_898;
        local_b0 = local_8b0;
        uStack_a8 = uStack_8a8;
        auVar55._8_8_ = uStack_8a8;
        auVar55._0_8_ = local_8b0;
        auVar2 = vcmpps_avx(auVar55,auVar1,1);
        local_8e0._0_8_ = auVar2._0_8_;
        local_60 = local_8e0._0_8_;
        local_8e0._8_8_ = auVar2._8_8_;
        uStack_58 = local_8e0._8_8_;
        local_70 = 0x3f8000003f800000;
        uStack_68 = 0x3f8000003f800000;
        auVar57._8_8_ = 0x3f8000003f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        local_8e0 = vpand_avx(auVar2,auVar57);
        local_7f0 = local_8a0;
        uStack_7e8 = uStack_898;
        local_800 = local_8e0._0_8_;
        uStack_7f8 = local_8e0._8_8_;
        _local_8b0 = vsubps_avx(auVar1,local_8e0);
        local_6c0 = 0x3f3180003f318000;
        uStack_6b8 = 0x3f3180003f318000;
        local_6b0._0_4_ = local_8b0._0_4_;
        local_6b0._4_4_ = local_8b0._4_4_;
        uStack_6a8._0_4_ = local_8b0._8_4_;
        uStack_6a8._4_4_ = local_8b0._12_4_;
        local_8a0 = CONCAT44(local_6b0._4_4_ * 0.6933594,(float)local_6b0 * 0.6933594);
        uStack_898._0_4_ = (float)uStack_6a8 * 0.6933594;
        uStack_898._4_4_ = uStack_6a8._4_4_ * 0.6933594;
        local_6d0 = local_8b0;
        uStack_6c8 = uStack_8a8;
        local_6e0 = 0xb95e8083b95e8083;
        uStack_6d8 = 0xb95e8083b95e8083;
        local_810 = local_890._0_8_;
        uStack_808 = local_890._8_8_;
        local_820 = local_8a0;
        uStack_818 = uStack_898;
        auVar43._8_8_ = uStack_898;
        auVar43._0_8_ = local_8a0;
        auVar2 = vsubps_avx(auVar3,auVar43);
        local_890._0_8_ = auVar2._0_8_;
        local_830 = local_890._0_8_;
        local_890._8_8_ = auVar2._8_8_;
        uStack_828 = local_890._8_8_;
        local_840 = CONCAT44(local_6b0._4_4_ * -0.00021219444,(float)local_6b0 * -0.00021219444);
        uStack_838 = CONCAT44(uStack_6a8._4_4_ * -0.00021219444,(float)uStack_6a8 * -0.00021219444);
        auVar42._8_8_ = uStack_838;
        auVar42._0_8_ = local_840;
        local_890 = vsubps_avx(auVar2,auVar42);
        local_700 = local_890._0_8_;
        uStack_6f8 = local_890._8_8_;
        local_6f0._0_4_ = local_890._0_4_;
        local_6f0._4_4_ = local_890._4_4_;
        uStack_6e8._0_4_ = local_890._8_4_;
        uStack_6e8._4_4_ = local_890._12_4_;
        local_8f0 = (float)local_6f0 * (float)local_6f0;
        fStack_8ec = local_6f0._4_4_ * local_6f0._4_4_;
        fStack_8e8 = (float)uStack_6e8 * (float)uStack_6e8;
        fStack_8e4 = uStack_6e8._4_4_ * uStack_6e8._4_4_;
        local_710 = 0x3950696739506967;
        uStack_708 = 0x3950696739506967;
        local_720 = local_890._0_8_;
        uStack_718 = local_890._8_8_;
        local_5b0 = CONCAT44(local_6f0._4_4_ * 0.00019875691,(float)local_6f0 * 0.00019875691);
        uStack_5a8 = CONCAT44(uStack_6e8._4_4_ * 0.00019875691,(float)uStack_6e8 * 0.00019875691);
        local_5c0 = 0x3ab743ce3ab743ce;
        uStack_5b8 = 0x3ab743ce3ab743ce;
        local_900 = (float)local_6f0 * 0.00019875691 + 0.0013981999;
        fStack_8fc = local_6f0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_8f8 = (float)uStack_6e8 * 0.00019875691 + 0.0013981999;
        fStack_8f4 = uStack_6e8._4_4_ * 0.00019875691 + 0.0013981999;
        local_730 = CONCAT44(fStack_8fc,local_900);
        uStack_728 = CONCAT44(fStack_8f4,fStack_8f8);
        local_740 = local_890._0_8_;
        uStack_738 = local_890._8_8_;
        local_900 = local_900 * (float)local_6f0;
        fStack_8fc = fStack_8fc * local_6f0._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_6e8;
        fStack_8f4 = fStack_8f4 * uStack_6e8._4_4_;
        local_5d0 = CONCAT44(fStack_8fc,local_900);
        uStack_5c8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_5e0 = 0x3c0889083c088908;
        uStack_5d8 = 0x3c0889083c088908;
        local_900 = local_900 + 0.008333452;
        fStack_8fc = fStack_8fc + 0.008333452;
        fStack_8f8 = fStack_8f8 + 0.008333452;
        fStack_8f4 = fStack_8f4 + 0.008333452;
        local_750 = CONCAT44(fStack_8fc,local_900);
        uStack_748 = CONCAT44(fStack_8f4,fStack_8f8);
        local_760 = local_890._0_8_;
        uStack_758 = local_890._8_8_;
        local_900 = local_900 * (float)local_6f0;
        fStack_8fc = fStack_8fc * local_6f0._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_6e8;
        fStack_8f4 = fStack_8f4 * uStack_6e8._4_4_;
        local_5f0 = CONCAT44(fStack_8fc,local_900);
        uStack_5e8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_600 = 0x3d2aa9c13d2aa9c1;
        uStack_5f8 = 0x3d2aa9c13d2aa9c1;
        local_900 = local_900 + 0.041665796;
        fStack_8fc = fStack_8fc + 0.041665796;
        fStack_8f8 = fStack_8f8 + 0.041665796;
        fStack_8f4 = fStack_8f4 + 0.041665796;
        local_770 = CONCAT44(fStack_8fc,local_900);
        uStack_768 = CONCAT44(fStack_8f4,fStack_8f8);
        local_780 = local_890._0_8_;
        uStack_778 = local_890._8_8_;
        local_900 = local_900 * (float)local_6f0;
        fStack_8fc = fStack_8fc * local_6f0._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_6e8;
        fStack_8f4 = fStack_8f4 * uStack_6e8._4_4_;
        local_610 = CONCAT44(fStack_8fc,local_900);
        uStack_608 = CONCAT44(fStack_8f4,fStack_8f8);
        local_620 = 0x3e2aaaaa3e2aaaaa;
        uStack_618 = 0x3e2aaaaa3e2aaaaa;
        local_900 = local_900 + 0.16666666;
        fStack_8fc = fStack_8fc + 0.16666666;
        fStack_8f8 = fStack_8f8 + 0.16666666;
        fStack_8f4 = fStack_8f4 + 0.16666666;
        local_790 = CONCAT44(fStack_8fc,local_900);
        uStack_788 = CONCAT44(fStack_8f4,fStack_8f8);
        local_7a0 = local_890._0_8_;
        uStack_798 = local_890._8_8_;
        local_900 = local_900 * (float)local_6f0;
        fStack_8fc = fStack_8fc * local_6f0._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_6e8;
        fStack_8f4 = fStack_8f4 * uStack_6e8._4_4_;
        local_630 = CONCAT44(fStack_8fc,local_900);
        uStack_628 = CONCAT44(fStack_8f4,fStack_8f8);
        local_900 = local_900 + 0.5;
        fStack_8fc = fStack_8fc + 0.5;
        fStack_8f8 = fStack_8f8 + 0.5;
        fStack_8f4 = fStack_8f4 + 0.5;
        local_7b0 = CONCAT44(fStack_8fc,local_900);
        uStack_7a8 = CONCAT44(fStack_8f4,fStack_8f8);
        local_7c0 = CONCAT44(fStack_8ec,local_8f0);
        uStack_7b8 = CONCAT44(fStack_8e4,fStack_8e8);
        local_900 = local_900 * local_8f0;
        fStack_8fc = fStack_8fc * fStack_8ec;
        fStack_8f8 = fStack_8f8 * fStack_8e8;
        fStack_8f4 = fStack_8f4 * fStack_8e4;
        local_650 = CONCAT44(fStack_8fc,local_900);
        uStack_648 = CONCAT44(fStack_8f4,fStack_8f8);
        local_660 = local_890._0_8_;
        uStack_658 = local_890._8_8_;
        local_900 = local_900 + (float)local_6f0;
        fStack_8fc = fStack_8fc + local_6f0._4_4_;
        fStack_8f8 = fStack_8f8 + (float)uStack_6e8;
        fStack_8f4 = fStack_8f4 + uStack_6e8._4_4_;
        local_670 = CONCAT44(fStack_8fc,local_900);
        uStack_668 = CONCAT44(fStack_8f4,fStack_8f8);
        local_680 = 0x3f8000003f800000;
        uStack_678 = 0x3f8000003f800000;
        local_900 = local_900 + 1.0;
        fStack_8fc = fStack_8fc + 1.0;
        fStack_8f8 = fStack_8f8 + 1.0;
        fStack_8f4 = fStack_8f4 + 1.0;
        local_110 = local_8b0;
        uStack_108 = uStack_8a8;
        local_8c0._4_4_ = (int)local_6b0._4_4_;
        local_8c0._0_4_ = (int)(float)local_6b0;
        local_8c0._8_4_ = (int)(float)uStack_6a8;
        local_8c0._12_4_ = (int)uStack_6a8._4_4_;
        local_870 = local_8c0._0_8_;
        uStack_868 = local_8c0._8_8_;
        local_880 = 0x7f0000007f;
        uStack_878 = 0x7f0000007f;
        auVar41._8_8_ = local_8c0._8_8_;
        auVar41._0_8_ = local_8c0._0_8_;
        auVar40._8_8_ = 0x7f0000007f;
        auVar40._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar41,auVar40);
        local_8c0._0_8_ = auVar2._0_8_;
        local_850 = local_8c0._0_8_;
        local_8c0._8_8_ = auVar2._8_8_;
        uStack_848 = local_8c0._8_8_;
        local_854 = 0x17;
        local_8c0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_8c0._0_8_;
        uStack_38 = local_8c0._8_8_;
        local_910 = local_8c0._0_8_;
        uStack_908 = local_8c0._8_8_;
        local_7d0._4_4_ = fStack_8fc;
        local_7d0._0_4_ = local_900;
        local_7d0._8_4_ = fStack_8f8;
        local_7d0._12_4_ = fStack_8f4;
        local_7e0._0_4_ = local_8c0._0_4_;
        local_7e0._4_4_ = local_8c0._4_4_;
        uStack_7d8._0_4_ = local_8c0._8_4_;
        uStack_7d8._4_4_ = local_8c0._12_4_;
        local_900 = local_900 * (float)local_7e0;
        fStack_8fc = fStack_8fc * local_7e0._4_4_;
        fStack_8f8 = fStack_8f8 * (float)uStack_7d8;
        fStack_8f4 = fStack_8f4 * uStack_7d8._4_4_;
        local_950 = CONCAT44(fStack_8fc,local_900);
        uStack_948 = CONCAT44(fStack_8f4,fStack_8f8);
        local_990 = local_900 + 1.0;
        fStack_98c = fStack_8fc + 1.0;
        fStack_988 = fStack_8f8 + 1.0;
        fStack_984 = fStack_8f4 + 1.0;
        auVar38._4_4_ = fStack_98c;
        auVar38._0_4_ = local_990;
        auVar38._8_4_ = fStack_988;
        auVar38._12_4_ = fStack_984;
        _local_a80 = vdivps_avx(local_980,auVar38);
        local_ae0._0_4_ = (float)local_a80._0_4_ * 2.0;
        local_ae0._4_4_ = (float)local_a80._4_4_ * 2.0;
        local_ae0._8_4_ = fStack_a78 * 2.0;
        local_ae0._12_4_ = fStack_a74 * 2.0;
        auVar35._8_8_ = 0x3f8000003f800000;
        auVar35._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(local_ae0,auVar35);
        local_2558 = local_2880;
        local_2910 = auVar2._0_8_;
        local_2570 = local_2910;
        uStack_2908 = auVar2._8_8_;
        uStack_2568 = uStack_2908;
        *(undefined1 (*) [16])*local_2880 = auVar2;
        local_2880 = (undefined1 (*) [32])(*local_2880 + 0x10);
        uStack_b4c = local_b50;
        uStack_b48 = local_b50;
        uStack_b44 = local_b50;
        uStack_b2c = local_b30;
        uStack_b28 = local_b30;
        uStack_b24 = local_b30;
        local_af0 = local_25c0;
        uStack_ae8 = uStack_25b8;
        local_a90 = local_25d0;
        uStack_a88 = uStack_25c8;
        local_a70 = local_25d0;
        uStack_a68 = uStack_25c8;
        local_a60 = local_25b0;
        uStack_a58 = uStack_25a8;
        uStack_9cc = local_9d0;
        uStack_9c8 = local_9d0;
        uStack_9c4 = local_9d0;
        local_940 = local_980;
        local_7e0 = local_8c0._0_8_;
        uStack_7d8 = local_8c0._8_8_;
        local_6f0 = local_700;
        uStack_6e8 = uStack_6f8;
        local_6b0 = local_8b0;
        uStack_6a8 = uStack_8a8;
        local_690 = uVar7;
        uStack_688 = uVar8;
        local_5a0 = local_640;
        uStack_598 = uStack_638;
        local_1d0 = local_1e0;
      }
      for (; local_28cc < local_2760; local_28cc = local_28cc + 1) {
        dVar62 = std::tanh((double)(ulong)*(uint *)*local_2880);
        *(int *)*local_2880 = SUB84(dVar62,0);
        local_2880 = (undefined1 (*) [32])(*local_2880 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}